

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation_state.cpp
# Opt level: O0

string * __thiscall
spvtools::val::ValidationState_t::VkErrorID_abi_cxx11_
          (string *__return_storage_ptr__,ValidationState_t *this,uint32_t id,char *param_2)

{
  bool bVar1;
  allocator<char> local_161;
  allocator<char> local_160;
  allocator<char> local_15f;
  allocator<char> local_15e;
  allocator<char> local_15d;
  allocator<char> local_15c;
  allocator<char> local_15b;
  allocator<char> local_15a;
  allocator<char> local_159;
  allocator<char> local_158;
  allocator<char> local_157;
  allocator<char> local_156;
  allocator<char> local_155;
  allocator<char> local_154;
  allocator<char> local_153;
  allocator<char> local_152;
  allocator<char> local_151;
  allocator<char> local_150;
  allocator<char> local_14f;
  allocator<char> local_14e;
  allocator<char> local_14d;
  allocator<char> local_14c;
  allocator<char> local_14b;
  allocator<char> local_14a;
  allocator<char> local_149;
  allocator<char> local_148;
  allocator<char> local_147;
  allocator<char> local_146;
  allocator<char> local_145;
  allocator<char> local_144;
  allocator<char> local_143;
  allocator<char> local_142;
  allocator<char> local_141;
  allocator<char> local_140;
  allocator<char> local_13f;
  allocator<char> local_13e;
  allocator<char> local_13d;
  allocator<char> local_13c;
  allocator<char> local_13b;
  allocator<char> local_13a;
  allocator<char> local_139;
  allocator<char> local_138;
  allocator<char> local_137;
  allocator<char> local_136;
  allocator<char> local_135;
  allocator<char> local_134;
  allocator<char> local_133;
  allocator<char> local_132;
  allocator<char> local_131;
  allocator<char> local_130;
  allocator<char> local_12f;
  allocator<char> local_12e;
  allocator<char> local_12d;
  allocator<char> local_12c;
  allocator<char> local_12b;
  allocator<char> local_12a;
  allocator<char> local_129;
  allocator<char> local_128;
  allocator<char> local_127;
  allocator<char> local_126;
  allocator<char> local_125;
  allocator<char> local_124;
  allocator<char> local_123;
  allocator<char> local_122;
  allocator<char> local_121;
  allocator<char> local_120;
  allocator<char> local_11f;
  allocator<char> local_11e;
  allocator<char> local_11d;
  allocator<char> local_11c;
  allocator<char> local_11b;
  allocator<char> local_11a;
  allocator<char> local_119;
  allocator<char> local_118;
  allocator<char> local_117;
  allocator<char> local_116;
  allocator<char> local_115;
  allocator<char> local_114;
  allocator<char> local_113;
  allocator<char> local_112;
  allocator<char> local_111;
  allocator<char> local_110;
  allocator<char> local_10f;
  allocator<char> local_10e;
  allocator<char> local_10d;
  allocator<char> local_10c;
  allocator<char> local_10b;
  allocator<char> local_10a;
  allocator<char> local_109;
  allocator<char> local_108;
  allocator<char> local_107;
  allocator<char> local_106;
  allocator<char> local_105;
  allocator<char> local_104;
  allocator<char> local_103;
  allocator<char> local_102;
  allocator<char> local_101;
  allocator<char> local_100;
  allocator<char> local_ff;
  allocator<char> local_fe;
  allocator<char> local_fd;
  allocator<char> local_fc;
  allocator<char> local_fb;
  allocator<char> local_fa;
  allocator<char> local_f9;
  allocator<char> local_f8;
  allocator<char> local_f7;
  allocator<char> local_f6;
  allocator<char> local_f5;
  allocator<char> local_f4;
  allocator<char> local_f3;
  allocator<char> local_f2;
  allocator<char> local_f1;
  allocator<char> local_f0;
  allocator<char> local_ef;
  allocator<char> local_ee;
  allocator<char> local_ed;
  allocator<char> local_ec;
  allocator<char> local_eb;
  allocator<char> local_ea;
  allocator<char> local_e9;
  allocator<char> local_e8;
  allocator<char> local_e7;
  allocator<char> local_e6;
  allocator<char> local_e5;
  allocator<char> local_e4;
  allocator<char> local_e3;
  allocator<char> local_e2;
  allocator<char> local_e1;
  allocator<char> local_e0;
  allocator<char> local_df;
  allocator<char> local_de;
  allocator<char> local_dd;
  allocator<char> local_dc;
  allocator<char> local_db;
  allocator<char> local_da;
  allocator<char> local_d9;
  allocator<char> local_d8;
  allocator<char> local_d7;
  allocator<char> local_d6;
  allocator<char> local_d5;
  allocator<char> local_d4;
  allocator<char> local_d3;
  allocator<char> local_d2;
  allocator<char> local_d1;
  allocator<char> local_d0;
  allocator<char> local_cf;
  allocator<char> local_ce;
  allocator<char> local_cd;
  allocator<char> local_cc;
  allocator<char> local_cb;
  allocator<char> local_ca;
  allocator<char> local_c9;
  allocator<char> local_c8;
  allocator<char> local_c7;
  allocator<char> local_c6;
  allocator<char> local_c5;
  allocator<char> local_c4;
  allocator<char> local_c3;
  allocator<char> local_c2;
  allocator<char> local_c1;
  allocator<char> local_c0;
  allocator<char> local_bf;
  allocator<char> local_be;
  allocator<char> local_bd;
  allocator<char> local_bc;
  allocator<char> local_bb;
  allocator<char> local_ba;
  allocator<char> local_b9;
  allocator<char> local_b8;
  allocator<char> local_b7;
  allocator<char> local_b6;
  allocator<char> local_b5;
  allocator<char> local_b4;
  allocator<char> local_b3;
  allocator<char> local_b2;
  allocator<char> local_b1;
  allocator<char> local_b0;
  allocator<char> local_af;
  allocator<char> local_ae;
  allocator<char> local_ad;
  allocator<char> local_ac;
  allocator<char> local_ab;
  allocator<char> local_aa;
  allocator<char> local_a9;
  allocator<char> local_a8;
  allocator<char> local_a7;
  allocator<char> local_a6;
  allocator<char> local_a5;
  allocator<char> local_a4;
  allocator<char> local_a3;
  allocator<char> local_a2;
  allocator<char> local_a1;
  allocator<char> local_a0;
  allocator<char> local_9f;
  allocator<char> local_9e;
  allocator<char> local_9d;
  allocator<char> local_9c;
  allocator<char> local_9b;
  allocator<char> local_9a;
  allocator<char> local_99;
  allocator<char> local_98;
  allocator<char> local_97;
  allocator<char> local_96;
  allocator<char> local_95;
  allocator<char> local_94;
  allocator<char> local_93;
  allocator<char> local_92;
  allocator<char> local_91;
  allocator<char> local_90;
  allocator<char> local_8f;
  allocator<char> local_8e;
  allocator<char> local_8d;
  allocator<char> local_8c;
  allocator<char> local_8b;
  allocator<char> local_8a;
  allocator<char> local_89;
  allocator<char> local_88;
  allocator<char> local_87;
  allocator<char> local_86;
  allocator<char> local_85;
  allocator<char> local_84;
  allocator<char> local_83;
  allocator<char> local_82;
  allocator<char> local_81;
  allocator<char> local_80;
  allocator<char> local_7f;
  allocator<char> local_7e;
  allocator<char> local_7d;
  allocator<char> local_7c;
  allocator<char> local_7b;
  allocator<char> local_7a;
  allocator<char> local_79;
  allocator<char> local_78;
  allocator<char> local_77;
  allocator<char> local_76;
  allocator<char> local_75;
  allocator<char> local_74;
  allocator<char> local_73;
  allocator<char> local_72;
  allocator<char> local_71;
  allocator<char> local_70;
  allocator<char> local_6f;
  allocator<char> local_6e;
  allocator<char> local_6d;
  allocator<char> local_6c;
  allocator<char> local_6b;
  allocator<char> local_6a;
  allocator<char> local_69;
  allocator<char> local_68;
  allocator<char> local_67;
  allocator<char> local_66;
  allocator<char> local_65;
  allocator<char> local_64;
  allocator<char> local_63;
  allocator<char> local_62;
  allocator<char> local_61;
  allocator<char> local_60;
  allocator<char> local_5f;
  allocator<char> local_5e;
  allocator<char> local_5d;
  allocator<char> local_5c;
  allocator<char> local_5b;
  allocator<char> local_5a;
  allocator<char> local_59;
  allocator<char> local_58;
  allocator<char> local_57;
  allocator<char> local_56;
  allocator<char> local_55;
  allocator<char> local_54;
  allocator<char> local_53;
  allocator<char> local_52;
  allocator<char> local_51;
  allocator<char> local_50;
  allocator<char> local_4f;
  allocator<char> local_4e;
  allocator<char> local_4d;
  allocator<char> local_4c;
  allocator<char> local_4b;
  allocator<char> local_4a;
  allocator<char> local_49;
  allocator<char> local_48;
  allocator<char> local_47;
  allocator<char> local_46;
  allocator<char> local_45;
  allocator<char> local_44;
  allocator<char> local_43;
  allocator<char> local_42;
  allocator<char> local_41;
  allocator<char> local_40;
  allocator<char> local_3f;
  allocator<char> local_3e;
  allocator<char> local_3d;
  allocator<char> local_3c;
  allocator<char> local_3b;
  allocator<char> local_3a;
  allocator<char> local_39;
  allocator<char> local_38;
  allocator<char> local_37;
  allocator<char> local_36;
  allocator<char> local_35;
  allocator<char> local_34;
  allocator<char> local_33;
  allocator<char> local_32;
  allocator<char> local_31;
  allocator<char> local_30;
  allocator<char> local_2f;
  allocator<char> local_2e;
  allocator<char> local_2d;
  allocator<char> local_2c;
  allocator<char> local_2b;
  allocator<char> local_2a;
  allocator<char> local_29;
  char *local_28;
  char *param_2_local;
  ValidationState_t *pVStack_18;
  uint32_t id_local;
  ValidationState_t *this_local;
  
  local_28 = param_2;
  param_2_local._4_4_ = id;
  pVStack_18 = this;
  this_local = (ValidationState_t *)__return_storage_ptr__;
  bVar1 = spvIsVulkanEnv(this->context_->target_env);
  if (bVar1) {
    if (param_2_local._4_4_ == 0x103a) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,"[VUID-BaryCoordKHR-BaryCoordKHR-04154] ",
                 &local_2a);
      std::allocator<char>::~allocator(&local_2a);
    }
    else if (param_2_local._4_4_ == 0x103b) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,"[VUID-BaryCoordKHR-BaryCoordKHR-04155] ",
                 &local_2b);
      std::allocator<char>::~allocator(&local_2b);
    }
    else if (param_2_local._4_4_ == 0x103c) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,"[VUID-BaryCoordKHR-BaryCoordKHR-04156] ",
                 &local_2c);
      std::allocator<char>::~allocator(&local_2c);
    }
    else if (param_2_local._4_4_ == 0x1040) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,
                 "[VUID-BaryCoordNoPerspKHR-BaryCoordNoPerspKHR-04160] ",&local_2d);
      std::allocator<char>::~allocator(&local_2d);
    }
    else if (param_2_local._4_4_ == 0x1041) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,
                 "[VUID-BaryCoordNoPerspKHR-BaryCoordNoPerspKHR-04161] ",&local_2e);
      std::allocator<char>::~allocator(&local_2e);
    }
    else if (param_2_local._4_4_ == 0x1042) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,
                 "[VUID-BaryCoordNoPerspKHR-BaryCoordNoPerspKHR-04162] ",&local_2f);
      std::allocator<char>::~allocator(&local_2f);
    }
    else if (param_2_local._4_4_ == 0x1055) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,"[VUID-BaseInstance-BaseInstance-04181] ",
                 &local_30);
      std::allocator<char>::~allocator(&local_30);
    }
    else if (param_2_local._4_4_ == 0x1056) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,"[VUID-BaseInstance-BaseInstance-04182] ",
                 &local_31);
      std::allocator<char>::~allocator(&local_31);
    }
    else if (param_2_local._4_4_ == 0x1057) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,"[VUID-BaseInstance-BaseInstance-04183] ",
                 &local_32);
      std::allocator<char>::~allocator(&local_32);
    }
    else if (param_2_local._4_4_ == 0x1058) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,"[VUID-BaseVertex-BaseVertex-04184] ",&local_33);
      std::allocator<char>::~allocator(&local_33);
    }
    else if (param_2_local._4_4_ == 0x1059) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,"[VUID-BaseVertex-BaseVertex-04185] ",&local_34);
      std::allocator<char>::~allocator(&local_34);
    }
    else if (param_2_local._4_4_ == 0x105a) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,"[VUID-BaseVertex-BaseVertex-04186] ",&local_35);
      std::allocator<char>::~allocator(&local_35);
    }
    else if (param_2_local._4_4_ == 0x105b) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,"[VUID-ClipDistance-ClipDistance-04187] ",
                 &local_36);
      std::allocator<char>::~allocator(&local_36);
    }
    else if (param_2_local._4_4_ == 0x105c) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,"[VUID-ClipDistance-ClipDistance-04188] ",
                 &local_37);
      std::allocator<char>::~allocator(&local_37);
    }
    else if (param_2_local._4_4_ == 0x105d) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,"[VUID-ClipDistance-ClipDistance-04189] ",
                 &local_38);
      std::allocator<char>::~allocator(&local_38);
    }
    else if (param_2_local._4_4_ == 0x105e) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,"[VUID-ClipDistance-ClipDistance-04190] ",
                 &local_39);
      std::allocator<char>::~allocator(&local_39);
    }
    else if (param_2_local._4_4_ == 0x105f) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,"[VUID-ClipDistance-ClipDistance-04191] ",
                 &local_3a);
      std::allocator<char>::~allocator(&local_3a);
    }
    else if (param_2_local._4_4_ == 0x1064) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,"[VUID-CullDistance-CullDistance-04196] ",
                 &local_3b);
      std::allocator<char>::~allocator(&local_3b);
    }
    else if (param_2_local._4_4_ == 0x1065) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,"[VUID-CullDistance-CullDistance-04197] ",
                 &local_3c);
      std::allocator<char>::~allocator(&local_3c);
    }
    else if (param_2_local._4_4_ == 0x1066) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,"[VUID-CullDistance-CullDistance-04198] ",
                 &local_3d);
      std::allocator<char>::~allocator(&local_3d);
    }
    else if (param_2_local._4_4_ == 0x1067) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,"[VUID-CullDistance-CullDistance-04199] ",
                 &local_3e);
      std::allocator<char>::~allocator(&local_3e);
    }
    else if (param_2_local._4_4_ == 0x1068) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,"[VUID-CullDistance-CullDistance-04200] ",
                 &local_3f);
      std::allocator<char>::~allocator(&local_3f);
    }
    else if (param_2_local._4_4_ == 0x106d) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,"[VUID-DeviceIndex-DeviceIndex-04205] ",&local_43)
      ;
      std::allocator<char>::~allocator(&local_43);
    }
    else if (param_2_local._4_4_ == 0x106e) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,"[VUID-DeviceIndex-DeviceIndex-04206] ",&local_44)
      ;
      std::allocator<char>::~allocator(&local_44);
    }
    else if (param_2_local._4_4_ == 0x106f) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,"[VUID-DrawIndex-DrawIndex-04207] ",&local_45);
      std::allocator<char>::~allocator(&local_45);
    }
    else if (param_2_local._4_4_ == 0x1070) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,"[VUID-DrawIndex-DrawIndex-04208] ",&local_46);
      std::allocator<char>::~allocator(&local_46);
    }
    else if (param_2_local._4_4_ == 0x1071) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,"[VUID-DrawIndex-DrawIndex-04209] ",&local_47);
      std::allocator<char>::~allocator(&local_47);
    }
    else if (param_2_local._4_4_ == 0x1072) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,"[VUID-FragCoord-FragCoord-04210] ",&local_48);
      std::allocator<char>::~allocator(&local_48);
    }
    else if (param_2_local._4_4_ == 0x1073) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,"[VUID-FragCoord-FragCoord-04211] ",&local_49);
      std::allocator<char>::~allocator(&local_49);
    }
    else if (param_2_local._4_4_ == 0x1074) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,"[VUID-FragCoord-FragCoord-04212] ",&local_4a);
      std::allocator<char>::~allocator(&local_4a);
    }
    else if (param_2_local._4_4_ == 0x1075) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,"[VUID-FragDepth-FragDepth-04213] ",&local_4b);
      std::allocator<char>::~allocator(&local_4b);
    }
    else if (param_2_local._4_4_ == 0x1076) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,"[VUID-FragDepth-FragDepth-04214] ",&local_4c);
      std::allocator<char>::~allocator(&local_4c);
    }
    else if (param_2_local._4_4_ == 0x1077) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,"[VUID-FragDepth-FragDepth-04215] ",&local_4d);
      std::allocator<char>::~allocator(&local_4d);
    }
    else if (param_2_local._4_4_ == 0x1078) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,"[VUID-FragDepth-FragDepth-04216] ",&local_4e);
      std::allocator<char>::~allocator(&local_4e);
    }
    else if (param_2_local._4_4_ == 0x1079) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,
                 "[VUID-FragInvocationCountEXT-FragInvocationCountEXT-04217] ",&local_4f);
      std::allocator<char>::~allocator(&local_4f);
    }
    else if (param_2_local._4_4_ == 0x107a) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,
                 "[VUID-FragInvocationCountEXT-FragInvocationCountEXT-04218] ",&local_50);
      std::allocator<char>::~allocator(&local_50);
    }
    else if (param_2_local._4_4_ == 0x107b) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,
                 "[VUID-FragInvocationCountEXT-FragInvocationCountEXT-04219] ",&local_51);
      std::allocator<char>::~allocator(&local_51);
    }
    else if (param_2_local._4_4_ == 0x107c) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,"[VUID-FragSizeEXT-FragSizeEXT-04220] ",&local_52)
      ;
      std::allocator<char>::~allocator(&local_52);
    }
    else if (param_2_local._4_4_ == 0x107d) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,"[VUID-FragSizeEXT-FragSizeEXT-04221] ",&local_53)
      ;
      std::allocator<char>::~allocator(&local_53);
    }
    else if (param_2_local._4_4_ == 0x107e) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,"[VUID-FragSizeEXT-FragSizeEXT-04222] ",&local_54)
      ;
      std::allocator<char>::~allocator(&local_54);
    }
    else if (param_2_local._4_4_ == 0x107f) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,
                 "[VUID-FragStencilRefEXT-FragStencilRefEXT-04223] ",&local_55);
      std::allocator<char>::~allocator(&local_55);
    }
    else if (param_2_local._4_4_ == 0x1080) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,
                 "[VUID-FragStencilRefEXT-FragStencilRefEXT-04224] ",&local_56);
      std::allocator<char>::~allocator(&local_56);
    }
    else if (param_2_local._4_4_ == 0x1081) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,
                 "[VUID-FragStencilRefEXT-FragStencilRefEXT-04225] ",&local_57);
      std::allocator<char>::~allocator(&local_57);
    }
    else if (param_2_local._4_4_ == 0x1085) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,"[VUID-FrontFacing-FrontFacing-04229] ",&local_58)
      ;
      std::allocator<char>::~allocator(&local_58);
    }
    else if (param_2_local._4_4_ == 0x1086) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,"[VUID-FrontFacing-FrontFacing-04230] ",&local_59)
      ;
      std::allocator<char>::~allocator(&local_59);
    }
    else if (param_2_local._4_4_ == 0x1087) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,"[VUID-FrontFacing-FrontFacing-04231] ",&local_5a)
      ;
      std::allocator<char>::~allocator(&local_5a);
    }
    else if (param_2_local._4_4_ == 0x1088) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,"[VUID-FullyCoveredEXT-FullyCoveredEXT-04232] ",
                 &local_5b);
      std::allocator<char>::~allocator(&local_5b);
    }
    else if (param_2_local._4_4_ == 0x1089) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,"[VUID-FullyCoveredEXT-FullyCoveredEXT-04233] ",
                 &local_5c);
      std::allocator<char>::~allocator(&local_5c);
    }
    else if (param_2_local._4_4_ == 0x108a) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,"[VUID-FullyCoveredEXT-FullyCoveredEXT-04234] ",
                 &local_5d);
      std::allocator<char>::~allocator(&local_5d);
    }
    else if (param_2_local._4_4_ == 0x108c) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,
                 "[VUID-GlobalInvocationId-GlobalInvocationId-04236] ",&local_5e);
      std::allocator<char>::~allocator(&local_5e);
    }
    else if (param_2_local._4_4_ == 0x108d) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,
                 "[VUID-GlobalInvocationId-GlobalInvocationId-04237] ",&local_5f);
      std::allocator<char>::~allocator(&local_5f);
    }
    else if (param_2_local._4_4_ == 0x108e) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,
                 "[VUID-GlobalInvocationId-GlobalInvocationId-04238] ",&local_60);
      std::allocator<char>::~allocator(&local_60);
    }
    else if (param_2_local._4_4_ == 0x108f) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,"[VUID-HelperInvocation-HelperInvocation-04239] ",
                 &local_61);
      std::allocator<char>::~allocator(&local_61);
    }
    else if (param_2_local._4_4_ == 0x1090) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,"[VUID-HelperInvocation-HelperInvocation-04240] ",
                 &local_62);
      std::allocator<char>::~allocator(&local_62);
    }
    else if (param_2_local._4_4_ == 0x1091) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,"[VUID-HelperInvocation-HelperInvocation-04241] ",
                 &local_63);
      std::allocator<char>::~allocator(&local_63);
    }
    else if (param_2_local._4_4_ == 0x1092) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,"[VUID-HitKindKHR-HitKindKHR-04242] ",&local_64);
      std::allocator<char>::~allocator(&local_64);
    }
    else if (param_2_local._4_4_ == 0x1093) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,"[VUID-HitKindKHR-HitKindKHR-04243] ",&local_65);
      std::allocator<char>::~allocator(&local_65);
    }
    else if (param_2_local._4_4_ == 0x1094) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,"[VUID-HitKindKHR-HitKindKHR-04244] ",&local_66);
      std::allocator<char>::~allocator(&local_66);
    }
    else if (param_2_local._4_4_ == 0x1095) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,"[VUID-HitTNV-HitTNV-04245] ",&local_67);
      std::allocator<char>::~allocator(&local_67);
    }
    else if (param_2_local._4_4_ == 0x1096) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,"[VUID-HitTNV-HitTNV-04246] ",&local_68);
      std::allocator<char>::~allocator(&local_68);
    }
    else if (param_2_local._4_4_ == 0x1097) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,"[VUID-HitTNV-HitTNV-04247] ",&local_69);
      std::allocator<char>::~allocator(&local_69);
    }
    else if (param_2_local._4_4_ == 0x1098) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,
                 "[VUID-IncomingRayFlagsKHR-IncomingRayFlagsKHR-04248] ",&local_6a);
      std::allocator<char>::~allocator(&local_6a);
    }
    else if (param_2_local._4_4_ == 0x1099) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,
                 "[VUID-IncomingRayFlagsKHR-IncomingRayFlagsKHR-04249] ",&local_6b);
      std::allocator<char>::~allocator(&local_6b);
    }
    else if (param_2_local._4_4_ == 0x109a) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,
                 "[VUID-IncomingRayFlagsKHR-IncomingRayFlagsKHR-04250] ",&local_6c);
      std::allocator<char>::~allocator(&local_6c);
    }
    else if (param_2_local._4_4_ == 0x109b) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,
                 "[VUID-InstanceCustomIndexKHR-InstanceCustomIndexKHR-04251] ",&local_6d);
      std::allocator<char>::~allocator(&local_6d);
    }
    else if (param_2_local._4_4_ == 0x109c) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,
                 "[VUID-InstanceCustomIndexKHR-InstanceCustomIndexKHR-04252] ",&local_6e);
      std::allocator<char>::~allocator(&local_6e);
    }
    else if (param_2_local._4_4_ == 0x109d) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,
                 "[VUID-InstanceCustomIndexKHR-InstanceCustomIndexKHR-04253] ",&local_6f);
      std::allocator<char>::~allocator(&local_6f);
    }
    else if (param_2_local._4_4_ == 0x109e) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,"[VUID-InstanceId-InstanceId-04254] ",&local_70);
      std::allocator<char>::~allocator(&local_70);
    }
    else if (param_2_local._4_4_ == 0x109f) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,"[VUID-InstanceId-InstanceId-04255] ",&local_71);
      std::allocator<char>::~allocator(&local_71);
    }
    else if (param_2_local._4_4_ == 0x10a0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,"[VUID-InstanceId-InstanceId-04256] ",&local_72);
      std::allocator<char>::~allocator(&local_72);
    }
    else if (param_2_local._4_4_ == 0x10a1) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,"[VUID-InvocationId-InvocationId-04257] ",
                 &local_73);
      std::allocator<char>::~allocator(&local_73);
    }
    else if (param_2_local._4_4_ == 0x10a2) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,"[VUID-InvocationId-InvocationId-04258] ",
                 &local_74);
      std::allocator<char>::~allocator(&local_74);
    }
    else if (param_2_local._4_4_ == 0x10a3) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,"[VUID-InvocationId-InvocationId-04259] ",
                 &local_75);
      std::allocator<char>::~allocator(&local_75);
    }
    else if (param_2_local._4_4_ == 0x10a7) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,"[VUID-InstanceIndex-InstanceIndex-04263] ",
                 &local_76);
      std::allocator<char>::~allocator(&local_76);
    }
    else if (param_2_local._4_4_ == 0x10a8) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,"[VUID-InstanceIndex-InstanceIndex-04264] ",
                 &local_77);
      std::allocator<char>::~allocator(&local_77);
    }
    else if (param_2_local._4_4_ == 0x10a9) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,"[VUID-InstanceIndex-InstanceIndex-04265] ",
                 &local_78);
      std::allocator<char>::~allocator(&local_78);
    }
    else if (param_2_local._4_4_ == 0x10aa) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,"[VUID-LaunchIdKHR-LaunchIdKHR-04266] ",&local_79)
      ;
      std::allocator<char>::~allocator(&local_79);
    }
    else if (param_2_local._4_4_ == 0x10ab) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,"[VUID-LaunchIdKHR-LaunchIdKHR-04267] ",&local_7a)
      ;
      std::allocator<char>::~allocator(&local_7a);
    }
    else if (param_2_local._4_4_ == 0x10ac) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,"[VUID-LaunchIdKHR-LaunchIdKHR-04268] ",&local_7b)
      ;
      std::allocator<char>::~allocator(&local_7b);
    }
    else if (param_2_local._4_4_ == 0x10ad) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,"[VUID-LaunchSizeKHR-LaunchSizeKHR-04269] ",
                 &local_7c);
      std::allocator<char>::~allocator(&local_7c);
    }
    else if (param_2_local._4_4_ == 0x10ae) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,"[VUID-LaunchSizeKHR-LaunchSizeKHR-04270] ",
                 &local_7d);
      std::allocator<char>::~allocator(&local_7d);
    }
    else if (param_2_local._4_4_ == 0x10af) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,"[VUID-LaunchSizeKHR-LaunchSizeKHR-04271] ",
                 &local_7e);
      std::allocator<char>::~allocator(&local_7e);
    }
    else if (param_2_local._4_4_ == 0x10b0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,"[VUID-Layer-Layer-04272] ",&local_7f);
      std::allocator<char>::~allocator(&local_7f);
    }
    else if (param_2_local._4_4_ == 0x10b1) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,"[VUID-Layer-Layer-04273] ",&local_80);
      std::allocator<char>::~allocator(&local_80);
    }
    else if (param_2_local._4_4_ == 0x10b2) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,"[VUID-Layer-Layer-04274] ",&local_81);
      std::allocator<char>::~allocator(&local_81);
    }
    else if (param_2_local._4_4_ == 0x10b3) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,"[VUID-Layer-Layer-04275] ",&local_82);
      std::allocator<char>::~allocator(&local_82);
    }
    else if (param_2_local._4_4_ == 0x10b4) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,"[VUID-Layer-Layer-04276] ",&local_83);
      std::allocator<char>::~allocator(&local_83);
    }
    else if (param_2_local._4_4_ == 0x10b9) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,
                 "[VUID-LocalInvocationId-LocalInvocationId-04281] ",&local_84);
      std::allocator<char>::~allocator(&local_84);
    }
    else if (param_2_local._4_4_ == 0x10ba) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,
                 "[VUID-LocalInvocationId-LocalInvocationId-04282] ",&local_85);
      std::allocator<char>::~allocator(&local_85);
    }
    else if (param_2_local._4_4_ == 0x10bb) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,
                 "[VUID-LocalInvocationId-LocalInvocationId-04283] ",&local_86);
      std::allocator<char>::~allocator(&local_86);
    }
    else if (param_2_local._4_4_ == 0x10c5) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,"[VUID-NumSubgroups-NumSubgroups-04293] ",
                 &local_87);
      std::allocator<char>::~allocator(&local_87);
    }
    else if (param_2_local._4_4_ == 0x10c6) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,"[VUID-NumSubgroups-NumSubgroups-04294] ",
                 &local_88);
      std::allocator<char>::~allocator(&local_88);
    }
    else if (param_2_local._4_4_ == 0x10c7) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,"[VUID-NumSubgroups-NumSubgroups-04295] ",
                 &local_89);
      std::allocator<char>::~allocator(&local_89);
    }
    else if (param_2_local._4_4_ == 0x10c8) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,"[VUID-NumWorkgroups-NumWorkgroups-04296] ",
                 &local_8a);
      std::allocator<char>::~allocator(&local_8a);
    }
    else if (param_2_local._4_4_ == 0x10c9) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,"[VUID-NumWorkgroups-NumWorkgroups-04297] ",
                 &local_8b);
      std::allocator<char>::~allocator(&local_8b);
    }
    else if (param_2_local._4_4_ == 0x10ca) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,"[VUID-NumWorkgroups-NumWorkgroups-04298] ",
                 &local_8c);
      std::allocator<char>::~allocator(&local_8c);
    }
    else if (param_2_local._4_4_ == 0x10cb) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,
                 "[VUID-ObjectRayDirectionKHR-ObjectRayDirectionKHR-04299] ",&local_8d);
      std::allocator<char>::~allocator(&local_8d);
    }
    else if (param_2_local._4_4_ == 0x10cc) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,
                 "[VUID-ObjectRayDirectionKHR-ObjectRayDirectionKHR-04300] ",&local_8e);
      std::allocator<char>::~allocator(&local_8e);
    }
    else if (param_2_local._4_4_ == 0x10cd) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,
                 "[VUID-ObjectRayDirectionKHR-ObjectRayDirectionKHR-04301] ",&local_8f);
      std::allocator<char>::~allocator(&local_8f);
    }
    else if (param_2_local._4_4_ == 0x10ce) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,
                 "[VUID-ObjectRayOriginKHR-ObjectRayOriginKHR-04302] ",&local_90);
      std::allocator<char>::~allocator(&local_90);
    }
    else if (param_2_local._4_4_ == 0x10cf) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,
                 "[VUID-ObjectRayOriginKHR-ObjectRayOriginKHR-04303] ",&local_91);
      std::allocator<char>::~allocator(&local_91);
    }
    else if (param_2_local._4_4_ == 0x10d0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,
                 "[VUID-ObjectRayOriginKHR-ObjectRayOriginKHR-04304] ",&local_92);
      std::allocator<char>::~allocator(&local_92);
    }
    else if (param_2_local._4_4_ == 0x10d1) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,"[VUID-ObjectToWorldKHR-ObjectToWorldKHR-04305] ",
                 &local_93);
      std::allocator<char>::~allocator(&local_93);
    }
    else if (param_2_local._4_4_ == 0x10d2) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,"[VUID-ObjectToWorldKHR-ObjectToWorldKHR-04306] ",
                 &local_94);
      std::allocator<char>::~allocator(&local_94);
    }
    else if (param_2_local._4_4_ == 0x10d3) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,"[VUID-ObjectToWorldKHR-ObjectToWorldKHR-04307] ",
                 &local_95);
      std::allocator<char>::~allocator(&local_95);
    }
    else if (param_2_local._4_4_ == 0x10d4) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,"[VUID-PatchVertices-PatchVertices-04308] ",
                 &local_96);
      std::allocator<char>::~allocator(&local_96);
    }
    else if (param_2_local._4_4_ == 0x10d5) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,"[VUID-PatchVertices-PatchVertices-04309] ",
                 &local_97);
      std::allocator<char>::~allocator(&local_97);
    }
    else if (param_2_local._4_4_ == 0x10d6) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,"[VUID-PatchVertices-PatchVertices-04310] ",
                 &local_98);
      std::allocator<char>::~allocator(&local_98);
    }
    else if (param_2_local._4_4_ == 0x10d7) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,"[VUID-PointCoord-PointCoord-04311] ",&local_99);
      std::allocator<char>::~allocator(&local_99);
    }
    else if (param_2_local._4_4_ == 0x10d8) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,"[VUID-PointCoord-PointCoord-04312] ",&local_9a);
      std::allocator<char>::~allocator(&local_9a);
    }
    else if (param_2_local._4_4_ == 0x10d9) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,"[VUID-PointCoord-PointCoord-04313] ",&local_9b);
      std::allocator<char>::~allocator(&local_9b);
    }
    else if (param_2_local._4_4_ == 0x10da) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,"[VUID-PointSize-PointSize-04314] ",&local_9c);
      std::allocator<char>::~allocator(&local_9c);
    }
    else if (param_2_local._4_4_ == 0x10db) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,"[VUID-PointSize-PointSize-04315] ",&local_9d);
      std::allocator<char>::~allocator(&local_9d);
    }
    else if (param_2_local._4_4_ == 0x10dc) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,"[VUID-PointSize-PointSize-04316] ",&local_9e);
      std::allocator<char>::~allocator(&local_9e);
    }
    else if (param_2_local._4_4_ == 0x10dd) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,"[VUID-PointSize-PointSize-04317] ",&local_9f);
      std::allocator<char>::~allocator(&local_9f);
    }
    else if (param_2_local._4_4_ == 0x10de) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,"[VUID-Position-Position-04318] ",&local_a0);
      std::allocator<char>::~allocator(&local_a0);
    }
    else if (param_2_local._4_4_ == 0x10df) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,"[VUID-Position-Position-04319] ",&local_a1);
      std::allocator<char>::~allocator(&local_a1);
    }
    else if (param_2_local._4_4_ == 0x10e0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,"[VUID-Position-Position-04320] ",&local_a2);
      std::allocator<char>::~allocator(&local_a2);
    }
    else if (param_2_local._4_4_ == 0x10e1) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,"[VUID-Position-Position-04321] ",&local_a3);
      std::allocator<char>::~allocator(&local_a3);
    }
    else if (param_2_local._4_4_ == 0x10ea) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,"[VUID-PrimitiveId-PrimitiveId-04330] ",&local_a4)
      ;
      std::allocator<char>::~allocator(&local_a4);
    }
    else if (param_2_local._4_4_ == 0x10ee) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,"[VUID-PrimitiveId-PrimitiveId-04334] ",&local_a5)
      ;
      std::allocator<char>::~allocator(&local_a5);
    }
    else if (param_2_local._4_4_ == 0x10f1) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,"[VUID-PrimitiveId-PrimitiveId-04337] ",&local_a6)
      ;
      std::allocator<char>::~allocator(&local_a6);
    }
    else if (param_2_local._4_4_ == 0x10f9) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,
                 "[VUID-RayGeometryIndexKHR-RayGeometryIndexKHR-04345] ",&local_a7);
      std::allocator<char>::~allocator(&local_a7);
    }
    else if (param_2_local._4_4_ == 0x10fa) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,
                 "[VUID-RayGeometryIndexKHR-RayGeometryIndexKHR-04346] ",&local_a8);
      std::allocator<char>::~allocator(&local_a8);
    }
    else if (param_2_local._4_4_ == 0x10fb) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,
                 "[VUID-RayGeometryIndexKHR-RayGeometryIndexKHR-04347] ",&local_a9);
      std::allocator<char>::~allocator(&local_a9);
    }
    else if (param_2_local._4_4_ == 0x10fc) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,"[VUID-RayTmaxKHR-RayTmaxKHR-04348] ",&local_aa);
      std::allocator<char>::~allocator(&local_aa);
    }
    else if (param_2_local._4_4_ == 0x10fd) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,"[VUID-RayTmaxKHR-RayTmaxKHR-04349] ",&local_ab);
      std::allocator<char>::~allocator(&local_ab);
    }
    else if (param_2_local._4_4_ == 0x10fe) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,"[VUID-RayTmaxKHR-RayTmaxKHR-04350] ",&local_ac);
      std::allocator<char>::~allocator(&local_ac);
    }
    else if (param_2_local._4_4_ == 0x10ff) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,"[VUID-RayTminKHR-RayTminKHR-04351] ",&local_ad);
      std::allocator<char>::~allocator(&local_ad);
    }
    else if (param_2_local._4_4_ == 0x1100) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,"[VUID-RayTminKHR-RayTminKHR-04352] ",&local_ae);
      std::allocator<char>::~allocator(&local_ae);
    }
    else if (param_2_local._4_4_ == 0x1101) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,"[VUID-RayTminKHR-RayTminKHR-04353] ",&local_af);
      std::allocator<char>::~allocator(&local_af);
    }
    else if (param_2_local._4_4_ == 0x1102) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,"[VUID-SampleId-SampleId-04354] ",&local_b0);
      std::allocator<char>::~allocator(&local_b0);
    }
    else if (param_2_local._4_4_ == 0x1103) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,"[VUID-SampleId-SampleId-04355] ",&local_b1);
      std::allocator<char>::~allocator(&local_b1);
    }
    else if (param_2_local._4_4_ == 0x1104) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,"[VUID-SampleId-SampleId-04356] ",&local_b2);
      std::allocator<char>::~allocator(&local_b2);
    }
    else if (param_2_local._4_4_ == 0x1105) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,"[VUID-SampleMask-SampleMask-04357] ",&local_b3);
      std::allocator<char>::~allocator(&local_b3);
    }
    else if (param_2_local._4_4_ == 0x1106) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,"[VUID-SampleMask-SampleMask-04358] ",&local_b4);
      std::allocator<char>::~allocator(&local_b4);
    }
    else if (param_2_local._4_4_ == 0x1107) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,"[VUID-SampleMask-SampleMask-04359] ",&local_b5);
      std::allocator<char>::~allocator(&local_b5);
    }
    else if (param_2_local._4_4_ == 0x1108) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,"[VUID-SamplePosition-SamplePosition-04360] ",
                 &local_b6);
      std::allocator<char>::~allocator(&local_b6);
    }
    else if (param_2_local._4_4_ == 0x1109) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,"[VUID-SamplePosition-SamplePosition-04361] ",
                 &local_b7);
      std::allocator<char>::~allocator(&local_b7);
    }
    else if (param_2_local._4_4_ == 0x110a) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,"[VUID-SamplePosition-SamplePosition-04362] ",
                 &local_b8);
      std::allocator<char>::~allocator(&local_b8);
    }
    else if (param_2_local._4_4_ == 0x110f) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,"[VUID-SubgroupId-SubgroupId-04367] ",&local_b9);
      std::allocator<char>::~allocator(&local_b9);
    }
    else if (param_2_local._4_4_ == 0x1110) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,"[VUID-SubgroupId-SubgroupId-04368] ",&local_ba);
      std::allocator<char>::~allocator(&local_ba);
    }
    else if (param_2_local._4_4_ == 0x1111) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,"[VUID-SubgroupId-SubgroupId-04369] ",&local_bb);
      std::allocator<char>::~allocator(&local_bb);
    }
    else if (param_2_local._4_4_ == 0x1112) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,"[VUID-SubgroupEqMask-SubgroupEqMask-04370] ",
                 &local_bc);
      std::allocator<char>::~allocator(&local_bc);
    }
    else if (param_2_local._4_4_ == 0x1113) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,"[VUID-SubgroupEqMask-SubgroupEqMask-04371] ",
                 &local_bd);
      std::allocator<char>::~allocator(&local_bd);
    }
    else if (param_2_local._4_4_ == 0x1114) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,"[VUID-SubgroupGeMask-SubgroupGeMask-04372] ",
                 &local_be);
      std::allocator<char>::~allocator(&local_be);
    }
    else if (param_2_local._4_4_ == 0x1115) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,"[VUID-SubgroupGeMask-SubgroupGeMask-04373] ",
                 &local_bf);
      std::allocator<char>::~allocator(&local_bf);
    }
    else if (param_2_local._4_4_ == 0x1116) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,"[VUID-SubgroupGtMask-SubgroupGtMask-04374] ",
                 &local_c0);
      std::allocator<char>::~allocator(&local_c0);
    }
    else if (param_2_local._4_4_ == 0x1117) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,"[VUID-SubgroupGtMask-SubgroupGtMask-04375] ",
                 &local_c1);
      std::allocator<char>::~allocator(&local_c1);
    }
    else if (param_2_local._4_4_ == 0x1118) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,"[VUID-SubgroupLeMask-SubgroupLeMask-04376] ",
                 &local_c2);
      std::allocator<char>::~allocator(&local_c2);
    }
    else if (param_2_local._4_4_ == 0x1119) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,"[VUID-SubgroupLeMask-SubgroupLeMask-04377] ",
                 &local_c3);
      std::allocator<char>::~allocator(&local_c3);
    }
    else if (param_2_local._4_4_ == 0x111a) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,"[VUID-SubgroupLtMask-SubgroupLtMask-04378] ",
                 &local_c4);
      std::allocator<char>::~allocator(&local_c4);
    }
    else if (param_2_local._4_4_ == 0x111b) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,"[VUID-SubgroupLtMask-SubgroupLtMask-04379] ",
                 &local_c5);
      std::allocator<char>::~allocator(&local_c5);
    }
    else if (param_2_local._4_4_ == 0x111c) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,
                 "[VUID-SubgroupLocalInvocationId-SubgroupLocalInvocationId-04380] ",&local_c6);
      std::allocator<char>::~allocator(&local_c6);
    }
    else if (param_2_local._4_4_ == 0x111d) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,
                 "[VUID-SubgroupLocalInvocationId-SubgroupLocalInvocationId-04381] ",&local_c7);
      std::allocator<char>::~allocator(&local_c7);
    }
    else if (param_2_local._4_4_ == 0x111e) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,"[VUID-SubgroupSize-SubgroupSize-04382] ",
                 &local_c8);
      std::allocator<char>::~allocator(&local_c8);
    }
    else if (param_2_local._4_4_ == 0x111f) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,"[VUID-SubgroupSize-SubgroupSize-04383] ",
                 &local_c9);
      std::allocator<char>::~allocator(&local_c9);
    }
    else if (param_2_local._4_4_ == 0x1123) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,"[VUID-TessCoord-TessCoord-04387] ",&local_ca);
      std::allocator<char>::~allocator(&local_ca);
    }
    else if (param_2_local._4_4_ == 0x1124) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,"[VUID-TessCoord-TessCoord-04388] ",&local_cb);
      std::allocator<char>::~allocator(&local_cb);
    }
    else if (param_2_local._4_4_ == 0x1125) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,"[VUID-TessCoord-TessCoord-04389] ",&local_cc);
      std::allocator<char>::~allocator(&local_cc);
    }
    else if (param_2_local._4_4_ == 0x1126) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,"[VUID-TessLevelOuter-TessLevelOuter-04390] ",
                 &local_cd);
      std::allocator<char>::~allocator(&local_cd);
    }
    else if (param_2_local._4_4_ == 0x1127) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,"[VUID-TessLevelOuter-TessLevelOuter-04391] ",
                 &local_ce);
      std::allocator<char>::~allocator(&local_ce);
    }
    else if (param_2_local._4_4_ == 0x1128) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,"[VUID-TessLevelOuter-TessLevelOuter-04392] ",
                 &local_cf);
      std::allocator<char>::~allocator(&local_cf);
    }
    else if (param_2_local._4_4_ == 0x1129) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,"[VUID-TessLevelOuter-TessLevelOuter-04393] ",
                 &local_d0);
      std::allocator<char>::~allocator(&local_d0);
    }
    else if (param_2_local._4_4_ == 0x112a) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,"[VUID-TessLevelInner-TessLevelInner-04394] ",
                 &local_d1);
      std::allocator<char>::~allocator(&local_d1);
    }
    else if (param_2_local._4_4_ == 0x112b) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,"[VUID-TessLevelInner-TessLevelInner-04395] ",
                 &local_d2);
      std::allocator<char>::~allocator(&local_d2);
    }
    else if (param_2_local._4_4_ == 0x112c) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,"[VUID-TessLevelInner-TessLevelInner-04396] ",
                 &local_d3);
      std::allocator<char>::~allocator(&local_d3);
    }
    else if (param_2_local._4_4_ == 0x112d) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,"[VUID-TessLevelInner-TessLevelInner-04397] ",
                 &local_d4);
      std::allocator<char>::~allocator(&local_d4);
    }
    else if (param_2_local._4_4_ == 0x112e) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,"[VUID-VertexIndex-VertexIndex-04398] ",&local_d5)
      ;
      std::allocator<char>::~allocator(&local_d5);
    }
    else if (param_2_local._4_4_ == 0x112f) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,"[VUID-VertexIndex-VertexIndex-04399] ",&local_d6)
      ;
      std::allocator<char>::~allocator(&local_d6);
    }
    else if (param_2_local._4_4_ == 0x1130) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,"[VUID-VertexIndex-VertexIndex-04400] ",&local_d7)
      ;
      std::allocator<char>::~allocator(&local_d7);
    }
    else if (param_2_local._4_4_ == 0x1131) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,"[VUID-ViewIndex-ViewIndex-04401] ",&local_d8);
      std::allocator<char>::~allocator(&local_d8);
    }
    else if (param_2_local._4_4_ == 0x1132) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,"[VUID-ViewIndex-ViewIndex-04402] ",&local_d9);
      std::allocator<char>::~allocator(&local_d9);
    }
    else if (param_2_local._4_4_ == 0x1133) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,"[VUID-ViewIndex-ViewIndex-04403] ",&local_da);
      std::allocator<char>::~allocator(&local_da);
    }
    else if (param_2_local._4_4_ == 0x1134) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,"[VUID-ViewportIndex-ViewportIndex-04404] ",
                 &local_db);
      std::allocator<char>::~allocator(&local_db);
    }
    else if (param_2_local._4_4_ == 0x1135) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,"[VUID-ViewportIndex-ViewportIndex-04405] ",
                 &local_dc);
      std::allocator<char>::~allocator(&local_dc);
    }
    else if (param_2_local._4_4_ == 0x1136) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,"[VUID-ViewportIndex-ViewportIndex-04406] ",
                 &local_dd);
      std::allocator<char>::~allocator(&local_dd);
    }
    else if (param_2_local._4_4_ == 0x1137) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,"[VUID-ViewportIndex-ViewportIndex-04407] ",
                 &local_de);
      std::allocator<char>::~allocator(&local_de);
    }
    else if (param_2_local._4_4_ == 0x1138) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,"[VUID-ViewportIndex-ViewportIndex-04408] ",
                 &local_df);
      std::allocator<char>::~allocator(&local_df);
    }
    else if (param_2_local._4_4_ == 0x1146) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,"[VUID-WorkgroupId-WorkgroupId-04422] ",&local_e0)
      ;
      std::allocator<char>::~allocator(&local_e0);
    }
    else if (param_2_local._4_4_ == 0x1147) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,"[VUID-WorkgroupId-WorkgroupId-04423] ",&local_e1)
      ;
      std::allocator<char>::~allocator(&local_e1);
    }
    else if (param_2_local._4_4_ == 0x1148) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,"[VUID-WorkgroupId-WorkgroupId-04424] ",&local_e2)
      ;
      std::allocator<char>::~allocator(&local_e2);
    }
    else if (param_2_local._4_4_ == 0x1149) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,"[VUID-WorkgroupSize-WorkgroupSize-04425] ",
                 &local_e3);
      std::allocator<char>::~allocator(&local_e3);
    }
    else if (param_2_local._4_4_ == 0x114a) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,"[VUID-WorkgroupSize-WorkgroupSize-04426] ",
                 &local_e4);
      std::allocator<char>::~allocator(&local_e4);
    }
    else if (param_2_local._4_4_ == 0x114b) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,"[VUID-WorkgroupSize-WorkgroupSize-04427] ",
                 &local_e5);
      std::allocator<char>::~allocator(&local_e5);
    }
    else if (param_2_local._4_4_ == 0x114c) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,
                 "[VUID-WorldRayDirectionKHR-WorldRayDirectionKHR-04428] ",&local_e6);
      std::allocator<char>::~allocator(&local_e6);
    }
    else if (param_2_local._4_4_ == 0x114d) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,
                 "[VUID-WorldRayDirectionKHR-WorldRayDirectionKHR-04429] ",&local_e7);
      std::allocator<char>::~allocator(&local_e7);
    }
    else if (param_2_local._4_4_ == 0x114e) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,
                 "[VUID-WorldRayDirectionKHR-WorldRayDirectionKHR-04430] ",&local_e8);
      std::allocator<char>::~allocator(&local_e8);
    }
    else if (param_2_local._4_4_ == 0x114f) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,
                 "[VUID-WorldRayOriginKHR-WorldRayOriginKHR-04431] ",&local_e9);
      std::allocator<char>::~allocator(&local_e9);
    }
    else if (param_2_local._4_4_ == 0x1150) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,
                 "[VUID-WorldRayOriginKHR-WorldRayOriginKHR-04432] ",&local_ea);
      std::allocator<char>::~allocator(&local_ea);
    }
    else if (param_2_local._4_4_ == 0x1151) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,
                 "[VUID-WorldRayOriginKHR-WorldRayOriginKHR-04433] ",&local_eb);
      std::allocator<char>::~allocator(&local_eb);
    }
    else if (param_2_local._4_4_ == 0x1152) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,"[VUID-WorldToObjectKHR-WorldToObjectKHR-04434] ",
                 &local_ec);
      std::allocator<char>::~allocator(&local_ec);
    }
    else if (param_2_local._4_4_ == 0x1153) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,"[VUID-WorldToObjectKHR-WorldToObjectKHR-04435] ",
                 &local_ed);
      std::allocator<char>::~allocator(&local_ed);
    }
    else if (param_2_local._4_4_ == 0x1154) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,"[VUID-WorldToObjectKHR-WorldToObjectKHR-04436] ",
                 &local_ee);
      std::allocator<char>::~allocator(&local_ee);
    }
    else if (param_2_local._4_4_ == 0x1184) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,
                 "[VUID-PrimitiveShadingRateKHR-PrimitiveShadingRateKHR-04484] ",&local_ef);
      std::allocator<char>::~allocator(&local_ef);
    }
    else if (param_2_local._4_4_ == 0x1185) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,
                 "[VUID-PrimitiveShadingRateKHR-PrimitiveShadingRateKHR-04485] ",&local_f0);
      std::allocator<char>::~allocator(&local_f0);
    }
    else if (param_2_local._4_4_ == 0x1186) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,
                 "[VUID-PrimitiveShadingRateKHR-PrimitiveShadingRateKHR-04486] ",&local_f1);
      std::allocator<char>::~allocator(&local_f1);
    }
    else if (param_2_local._4_4_ == 0x118a) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,"[VUID-ShadingRateKHR-ShadingRateKHR-04490] ",
                 &local_f2);
      std::allocator<char>::~allocator(&local_f2);
    }
    else if (param_2_local._4_4_ == 0x118b) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,"[VUID-ShadingRateKHR-ShadingRateKHR-04491] ",
                 &local_f3);
      std::allocator<char>::~allocator(&local_f3);
    }
    else if (param_2_local._4_4_ == 0x118c) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,"[VUID-ShadingRateKHR-ShadingRateKHR-04492] ",
                 &local_f4);
      std::allocator<char>::~allocator(&local_f4);
    }
    else if (param_2_local._4_4_ == 0x1219) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,"[VUID-StandaloneSpirv-None-04633] ",&local_f5);
      std::allocator<char>::~allocator(&local_f5);
    }
    else if (param_2_local._4_4_ == 0x121a) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,"[VUID-StandaloneSpirv-None-04634] ",&local_f6);
      std::allocator<char>::~allocator(&local_f6);
    }
    else if (param_2_local._4_4_ == 0x121b) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,"[VUID-StandaloneSpirv-None-04635] ",&local_f7);
      std::allocator<char>::~allocator(&local_f7);
    }
    else if (param_2_local._4_4_ == 0x121c) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,"[VUID-StandaloneSpirv-None-04636] ",&local_f8);
      std::allocator<char>::~allocator(&local_f8);
    }
    else if (param_2_local._4_4_ == 0x121d) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,"[VUID-StandaloneSpirv-None-04637] ",&local_f9);
      std::allocator<char>::~allocator(&local_f9);
    }
    else if (param_2_local._4_4_ == 0x121e) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,"[VUID-StandaloneSpirv-None-04638] ",&local_fa);
      std::allocator<char>::~allocator(&local_fa);
    }
    else if (param_2_local._4_4_ == 0x1220) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,"[VUID-StandaloneSpirv-None-04640] ",&local_fc);
      std::allocator<char>::~allocator(&local_fc);
    }
    else if (param_2_local._4_4_ == 0x1221) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,"[VUID-StandaloneSpirv-None-04641] ",&local_fd);
      std::allocator<char>::~allocator(&local_fd);
    }
    else if (param_2_local._4_4_ == 0x1222) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,"[VUID-StandaloneSpirv-None-04642] ",&local_fe);
      std::allocator<char>::~allocator(&local_fe);
    }
    else if (param_2_local._4_4_ == 0x1223) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,"[VUID-StandaloneSpirv-None-04643] ",&local_ff);
      std::allocator<char>::~allocator(&local_ff);
    }
    else if (param_2_local._4_4_ == 0x1224) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,"[VUID-StandaloneSpirv-None-04644] ",&local_100);
      std::allocator<char>::~allocator(&local_100);
    }
    else if (param_2_local._4_4_ == 0x1225) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,"[VUID-StandaloneSpirv-None-04645] ",&local_101);
      std::allocator<char>::~allocator(&local_101);
    }
    else if (param_2_local._4_4_ == 0x122a) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,"[VUID-StandaloneSpirv-OpControlBarrier-04650] ",
                 &local_102);
      std::allocator<char>::~allocator(&local_102);
    }
    else if (param_2_local._4_4_ == 0x122b) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,"[VUID-StandaloneSpirv-OpVariable-04651] ",
                 &local_103);
      std::allocator<char>::~allocator(&local_103);
    }
    else if (param_2_local._4_4_ == 0x122c) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,"[VUID-StandaloneSpirv-OpReadClockKHR-04652] ",
                 &local_104);
      std::allocator<char>::~allocator(&local_104);
    }
    else if (param_2_local._4_4_ == 0x122d) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,"[VUID-StandaloneSpirv-OriginLowerLeft-04653] ",
                 &local_105);
      std::allocator<char>::~allocator(&local_105);
    }
    else if (param_2_local._4_4_ == 0x122e) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,"[VUID-StandaloneSpirv-PixelCenterInteger-04654] "
                 ,&local_106);
      std::allocator<char>::~allocator(&local_106);
    }
    else if (param_2_local._4_4_ == 0x122f) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,"[VUID-StandaloneSpirv-UniformConstant-04655] ",
                 &local_107);
      std::allocator<char>::~allocator(&local_107);
    }
    else if (param_2_local._4_4_ == 0x1230) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,"[VUID-StandaloneSpirv-OpTypeImage-04656] ",
                 &local_108);
      std::allocator<char>::~allocator(&local_108);
    }
    else if (param_2_local._4_4_ == 0x1231) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,"[VUID-StandaloneSpirv-OpTypeImage-04657] ",
                 &local_109);
      std::allocator<char>::~allocator(&local_109);
    }
    else if (param_2_local._4_4_ == 0x1232) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,
                 "[VUID-StandaloneSpirv-OpImageTexelPointer-04658] ",&local_10a);
      std::allocator<char>::~allocator(&local_10a);
    }
    else if (param_2_local._4_4_ == 0x1233) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,
                 "[VUID-StandaloneSpirv-OpImageQuerySizeLod-04659] ",&local_10b);
      std::allocator<char>::~allocator(&local_10b);
    }
    else if (param_2_local._4_4_ == 0x1237) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,"[VUID-StandaloneSpirv-Offset-04663] ",&local_10c)
      ;
      std::allocator<char>::~allocator(&local_10c);
    }
    else if (param_2_local._4_4_ == 0x1238) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,"[VUID-StandaloneSpirv-OpImageGather-04664] ",
                 &local_10d);
      std::allocator<char>::~allocator(&local_10d);
    }
    else if (param_2_local._4_4_ == 0x123b) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,"[VUID-StandaloneSpirv-None-04667] ",&local_10e);
      std::allocator<char>::~allocator(&local_10e);
    }
    else if (param_2_local._4_4_ == 0x123d) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,"[VUID-StandaloneSpirv-GLSLShared-04669] ",
                 &local_10f);
      std::allocator<char>::~allocator(&local_10f);
    }
    else if (param_2_local._4_4_ == 0x123e) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,"[VUID-StandaloneSpirv-Flat-04670] ",&local_110);
      std::allocator<char>::~allocator(&local_110);
    }
    else if (param_2_local._4_4_ == 0x1243) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,"[VUID-StandaloneSpirv-FPRoundingMode-04675] ",
                 &local_111);
      std::allocator<char>::~allocator(&local_111);
    }
    else if (param_2_local._4_4_ == 0x1245) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,"[VUID-StandaloneSpirv-Invariant-04677] ",
                 &local_112);
      std::allocator<char>::~allocator(&local_112);
    }
    else if (param_2_local._4_4_ == 0x1248) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,"[VUID-StandaloneSpirv-OpTypeRuntimeArray-04680] "
                 ,&local_113);
      std::allocator<char>::~allocator(&local_113);
    }
    else if (param_2_local._4_4_ == 0x124a) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,"[VUID-StandaloneSpirv-OpControlBarrier-04682] ",
                 &local_114);
      std::allocator<char>::~allocator(&local_114);
    }
    else if (param_2_local._4_4_ == 0x124d) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,
                 "[VUID-StandaloneSpirv-OpGroupNonUniformBallotBitCount-04685] ",&local_116);
      std::allocator<char>::~allocator(&local_116);
    }
    else if (param_2_local._4_4_ == 0x124e) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,"[VUID-StandaloneSpirv-None-04686] ",&local_117);
      std::allocator<char>::~allocator(&local_117);
    }
    else if (param_2_local._4_4_ == 0x125a) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,"[VUID-StandaloneSpirv-RayPayloadKHR-04698] ",
                 &local_118);
      std::allocator<char>::~allocator(&local_118);
    }
    else if (param_2_local._4_4_ == 0x125b) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,
                 "[VUID-StandaloneSpirv-IncomingRayPayloadKHR-04699] ",&local_119);
      std::allocator<char>::~allocator(&local_119);
    }
    else if (param_2_local._4_4_ == 0x125c) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,
                 "[VUID-StandaloneSpirv-IncomingRayPayloadKHR-04700] ",&local_11a);
      std::allocator<char>::~allocator(&local_11a);
    }
    else if (param_2_local._4_4_ == 0x125d) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,"[VUID-StandaloneSpirv-HitAttributeKHR-04701] ",
                 &local_11b);
      std::allocator<char>::~allocator(&local_11b);
    }
    else if (param_2_local._4_4_ == 0x125e) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,"[VUID-StandaloneSpirv-HitAttributeKHR-04702] ",
                 &local_11c);
      std::allocator<char>::~allocator(&local_11c);
    }
    else if (param_2_local._4_4_ == 0x125f) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,"[VUID-StandaloneSpirv-HitAttributeKHR-04703] ",
                 &local_11d);
      std::allocator<char>::~allocator(&local_11d);
    }
    else if (param_2_local._4_4_ == 0x1260) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,"[VUID-StandaloneSpirv-CallableDataKHR-04704] ",
                 &local_11e);
      std::allocator<char>::~allocator(&local_11e);
    }
    else if (param_2_local._4_4_ == 0x1261) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,
                 "[VUID-StandaloneSpirv-IncomingCallableDataKHR-04705] ",&local_11f);
      std::allocator<char>::~allocator(&local_11f);
    }
    else if (param_2_local._4_4_ == 0x1262) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,
                 "[VUID-StandaloneSpirv-IncomingCallableDataKHR-04706] ",&local_120);
      std::allocator<char>::~allocator(&local_120);
    }
    else if (param_2_local._4_4_ == 0x1264) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,
                 "[VUID-StandaloneSpirv-PhysicalStorageBuffer64-04708] ",&local_122);
      std::allocator<char>::~allocator(&local_122);
    }
    else if (param_2_local._4_4_ == 0x1266) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,
                 "[VUID-StandaloneSpirv-PhysicalStorageBuffer64-04710] ",&local_123);
      std::allocator<char>::~allocator(&local_123);
    }
    else if (param_2_local._4_4_ == 0x1267) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,
                 "[VUID-StandaloneSpirv-OpTypeForwardPointer-04711] ",&local_124);
      std::allocator<char>::~allocator(&local_124);
    }
    else if (param_2_local._4_4_ == 0x127a) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,"[VUID-StandaloneSpirv-OpAtomicStore-04730] ",
                 &local_125);
      std::allocator<char>::~allocator(&local_125);
    }
    else if (param_2_local._4_4_ == 0x127b) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,"[VUID-StandaloneSpirv-OpAtomicLoad-04731] ",
                 &local_126);
      std::allocator<char>::~allocator(&local_126);
    }
    else if (param_2_local._4_4_ == 0x127c) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,"[VUID-StandaloneSpirv-OpMemoryBarrier-04732] ",
                 &local_127);
      std::allocator<char>::~allocator(&local_127);
    }
    else if (param_2_local._4_4_ == 0x127d) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,"[VUID-StandaloneSpirv-OpMemoryBarrier-04733] ",
                 &local_128);
      std::allocator<char>::~allocator(&local_128);
    }
    else if (param_2_local._4_4_ == 0x127e) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,"[VUID-StandaloneSpirv-OpVariable-04734] ",
                 &local_129);
      std::allocator<char>::~allocator(&local_129);
    }
    else if (param_2_local._4_4_ == 0x1288) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,"[VUID-StandaloneSpirv-Flat-04744] ",&local_12a);
      std::allocator<char>::~allocator(&local_12a);
    }
    else if (param_2_local._4_4_ == 0x12a9) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,"[VUID-StandaloneSpirv-OpImage-04777] ",&local_12b
                );
      std::allocator<char>::~allocator(&local_12b);
    }
    else if (param_2_local._4_4_ == 0x12ac) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,"[VUID-StandaloneSpirv-Result-04780] ",&local_12c)
      ;
      std::allocator<char>::~allocator(&local_12c);
    }
    else if (param_2_local._4_4_ == 0x12ad) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,"[VUID-StandaloneSpirv-Base-04781] ",&local_12d);
      std::allocator<char>::~allocator(&local_12d);
    }
    else if (param_2_local._4_4_ == 0x1333) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,"[VUID-StandaloneSpirv-Location-04915] ",
                 &local_12e);
      std::allocator<char>::~allocator(&local_12e);
    }
    else if (param_2_local._4_4_ == 0x1334) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,"[VUID-StandaloneSpirv-Location-04916] ",
                 &local_12f);
      std::allocator<char>::~allocator(&local_12f);
    }
    else if (param_2_local._4_4_ == 0x1335) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,"[VUID-StandaloneSpirv-Location-04917] ",
                 &local_130);
      std::allocator<char>::~allocator(&local_130);
    }
    else if (param_2_local._4_4_ == 0x1336) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,"[VUID-StandaloneSpirv-Location-04918] ",
                 &local_131);
      std::allocator<char>::~allocator(&local_131);
    }
    else if (param_2_local._4_4_ == 0x1337) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,"[VUID-StandaloneSpirv-Location-04919] ",
                 &local_132);
      std::allocator<char>::~allocator(&local_132);
    }
    else if (param_2_local._4_4_ == 0x1338) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,"[VUID-StandaloneSpirv-Component-04920] ",
                 &local_133);
      std::allocator<char>::~allocator(&local_133);
    }
    else if (param_2_local._4_4_ == 0x1339) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,"[VUID-StandaloneSpirv-Component-04921] ",
                 &local_134);
      std::allocator<char>::~allocator(&local_134);
    }
    else if (param_2_local._4_4_ == 0x133a) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,"[VUID-StandaloneSpirv-Component-04922] ",
                 &local_135);
      std::allocator<char>::~allocator(&local_135);
    }
    else if (param_2_local._4_4_ == 0x133b) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,"[VUID-StandaloneSpirv-Component-04923] ",
                 &local_136);
      std::allocator<char>::~allocator(&local_136);
    }
    else if (param_2_local._4_4_ == 0x133c) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,"[VUID-StandaloneSpirv-Component-04924] ",
                 &local_137);
      std::allocator<char>::~allocator(&local_137);
    }
    else if (param_2_local._4_4_ == 0x1839) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,"[VUID-StandaloneSpirv-Flat-06201] ",&local_138);
      std::allocator<char>::~allocator(&local_138);
    }
    else if (param_2_local._4_4_ == 0x183a) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,"[VUID-StandaloneSpirv-Flat-06202] ",&local_139);
      std::allocator<char>::~allocator(&local_139);
    }
    else if (param_2_local._4_4_ == 0x1846) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,"[VUID-StandaloneSpirv-OpTypeImage-06214] ",
                 &local_13a);
      std::allocator<char>::~allocator(&local_13a);
    }
    else if (param_2_local._4_4_ == 0x191a) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,"[VUID-StandaloneSpirv-LocalSize-06426] ",
                 &local_115);
      std::allocator<char>::~allocator(&local_115);
    }
    else if (param_2_local._4_4_ == 0x195b) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,"[VUID-StandaloneSpirv-DescriptorSet-06491] ",
                 &local_13b);
      std::allocator<char>::~allocator(&local_13b);
    }
    else if (param_2_local._4_4_ == 0x1a0f) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,"[VUID-StandaloneSpirv-OpTypeSampledImage-06671] "
                 ,&local_13c);
      std::allocator<char>::~allocator(&local_13c);
    }
    else if (param_2_local._4_4_ == 0x1a10) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,"[VUID-StandaloneSpirv-Location-06672] ",
                 &local_13d);
      std::allocator<char>::~allocator(&local_13d);
    }
    else if (param_2_local._4_4_ == 0x1a11) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,"[VUID-StandaloneSpirv-OpVariable-06673] ",
                 &local_13e);
      std::allocator<char>::~allocator(&local_13e);
    }
    else if (param_2_local._4_4_ == 0x1a12) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,"[VUID-StandaloneSpirv-OpEntryPoint-06674] ",
                 &local_13f);
      std::allocator<char>::~allocator(&local_13f);
    }
    else if (param_2_local._4_4_ == 0x1a13) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,"[VUID-StandaloneSpirv-PushConstant-06675] ",
                 &local_140);
      std::allocator<char>::~allocator(&local_140);
    }
    else if (param_2_local._4_4_ == 0x1a14) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,"[VUID-StandaloneSpirv-Uniform-06676] ",&local_141
                );
      std::allocator<char>::~allocator(&local_141);
    }
    else if (param_2_local._4_4_ == 0x1a15) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,"[VUID-StandaloneSpirv-UniformConstant-06677] ",
                 &local_142);
      std::allocator<char>::~allocator(&local_142);
    }
    else if (param_2_local._4_4_ == 0x1a16) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,
                 "[VUID-StandaloneSpirv-InputAttachmentIndex-06678] ",&local_143);
      std::allocator<char>::~allocator(&local_143);
    }
    else if (param_2_local._4_4_ == 0x1a4f) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,"[VUID-CullMaskKHR-CullMaskKHR-06735] ",&local_40)
      ;
      std::allocator<char>::~allocator(&local_40);
    }
    else if (param_2_local._4_4_ == 0x1a50) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,"[VUID-CullMaskKHR-CullMaskKHR-06736] ",&local_41)
      ;
      std::allocator<char>::~allocator(&local_41);
    }
    else if (param_2_local._4_4_ == 0x1a51) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,"[VUID-CullMaskKHR-CullMaskKHR-06737] ",&local_42)
      ;
      std::allocator<char>::~allocator(&local_42);
    }
    else if (param_2_local._4_4_ == 0x1a79) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,"[VUID-StandaloneSpirv-PerVertexKHR-06777] ",
                 &local_144);
      std::allocator<char>::~allocator(&local_144);
    }
    else if (param_2_local._4_4_ == 0x1a7a) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,"[VUID-StandaloneSpirv-Input-06778] ",&local_145);
      std::allocator<char>::~allocator(&local_145);
    }
    else if (param_2_local._4_4_ == 0x1a97) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,"[VUID-StandaloneSpirv-Uniform-06807] ",&local_146
                );
      std::allocator<char>::~allocator(&local_146);
    }
    else if (param_2_local._4_4_ == 0x1a98) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,"[VUID-StandaloneSpirv-PushConstant-06808] ",
                 &local_147);
      std::allocator<char>::~allocator(&local_147);
    }
    else if (param_2_local._4_4_ == 0x1b0c) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,"[VUID-StandaloneSpirv-OpTypeImage-06924] ",
                 &local_148);
      std::allocator<char>::~allocator(&local_148);
    }
    else if (param_2_local._4_4_ == 0x1b0d) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,"[VUID-StandaloneSpirv-Uniform-06925] ",&local_149
                );
      std::allocator<char>::~allocator(&local_149);
    }
    else if (param_2_local._4_4_ == 0x1b81) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,
                 "[VUID-PrimitivePointIndicesEXT-PrimitivePointIndicesEXT-07041] ",&local_14a);
      std::allocator<char>::~allocator(&local_14a);
    }
    else if (param_2_local._4_4_ == 0x1b83) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,
                 "[VUID-PrimitivePointIndicesEXT-PrimitivePointIndicesEXT-07043] ",&local_14b);
      std::allocator<char>::~allocator(&local_14b);
    }
    else if (param_2_local._4_4_ == 0x1b84) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,
                 "[VUID-PrimitivePointIndicesEXT-PrimitivePointIndicesEXT-07044] ",&local_14c);
      std::allocator<char>::~allocator(&local_14c);
    }
    else if (param_2_local._4_4_ == 0x1b87) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,
                 "[VUID-PrimitiveLineIndicesEXT-PrimitiveLineIndicesEXT-07047] ",&local_14d);
      std::allocator<char>::~allocator(&local_14d);
    }
    else if (param_2_local._4_4_ == 0x1b89) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,
                 "[VUID-PrimitiveLineIndicesEXT-PrimitiveLineIndicesEXT-07049] ",&local_14e);
      std::allocator<char>::~allocator(&local_14e);
    }
    else if (param_2_local._4_4_ == 0x1b8a) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,
                 "[VUID-PrimitiveLineIndicesEXT-PrimitiveLineIndicesEXT-07050] ",&local_14f);
      std::allocator<char>::~allocator(&local_14f);
    }
    else if (param_2_local._4_4_ == 0x1b8d) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,
                 "[VUID-PrimitiveTriangleIndicesEXT-PrimitiveTriangleIndicesEXT-07053] ",&local_150)
      ;
      std::allocator<char>::~allocator(&local_150);
    }
    else if (param_2_local._4_4_ == 0x1b8f) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,
                 "[VUID-PrimitiveTriangleIndicesEXT-PrimitiveTriangleIndicesEXT-07055] ",&local_151)
      ;
      std::allocator<char>::~allocator(&local_151);
    }
    else if (param_2_local._4_4_ == 0x1b90) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,
                 "[VUID-PrimitiveTriangleIndicesEXT-PrimitiveTriangleIndicesEXT-07056] ",&local_152)
      ;
      std::allocator<char>::~allocator(&local_152);
    }
    else if (param_2_local._4_4_ == 0x1bbe) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,"[VUID-StandaloneSpirv-MeshEXT-07102] ",&local_153
                );
      std::allocator<char>::~allocator(&local_153);
    }
    else if (param_2_local._4_4_ == 0x1bcf) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,
                 "[VUID-StandaloneSpirv-ShaderRecordBufferKHR-07119] ",&local_121);
      std::allocator<char>::~allocator(&local_121);
    }
    else if (param_2_local._4_4_ == 0x1c7a) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,"[VUID-StandaloneSpirv-Input-07290] ",&local_155);
      std::allocator<char>::~allocator(&local_155);
    }
    else if (param_2_local._4_4_ == 0x1c98) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,"[VUID-StandaloneSpirv-ExecutionModel-07320] ",
                 &local_154);
      std::allocator<char>::~allocator(&local_154);
    }
    else if (param_2_local._4_4_ == 0x1c99) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,"[VUID-StandaloneSpirv-None-07321] ",&local_fb);
      std::allocator<char>::~allocator(&local_fb);
    }
    else if (param_2_local._4_4_ == 0x1de2) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,"[VUID-StandaloneSpirv-Base-07650] ",&local_156);
      std::allocator<char>::~allocator(&local_156);
    }
    else if (param_2_local._4_4_ == 0x1de3) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,"[VUID-StandaloneSpirv-Base-07651] ",&local_157);
      std::allocator<char>::~allocator(&local_157);
    }
    else if (param_2_local._4_4_ == 0x1de4) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,"[VUID-StandaloneSpirv-Base-07652] ",&local_158);
      std::allocator<char>::~allocator(&local_158);
    }
    else if (param_2_local._4_4_ == 0x1e17) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,"[VUID-StandaloneSpirv-Component-07703] ",
                 &local_159);
      std::allocator<char>::~allocator(&local_159);
    }
    else if (param_2_local._4_4_ == 0x1f0f) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,"[VUID-StandaloneSpirv-SubgroupVoteKHR-07951] ",
                 &local_15a);
      std::allocator<char>::~allocator(&local_15a);
    }
    else if (param_2_local._4_4_ == 0x2211) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,"[VUID-StandaloneSpirv-OpEntryPoint-08721] ",
                 &local_15b);
      std::allocator<char>::~allocator(&local_15b);
    }
    else if (param_2_local._4_4_ == 0x2212) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,"[VUID-StandaloneSpirv-OpEntryPoint-08722] ",
                 &local_15c);
      std::allocator<char>::~allocator(&local_15c);
    }
    else if (param_2_local._4_4_ == 0x230d) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,"[VUID-StandaloneSpirv-Pointer-08973] ",&local_15d
                );
      std::allocator<char>::~allocator(&local_15d);
    }
    else if (param_2_local._4_4_ == 0x25a6) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,"[VUID-StandaloneSpirv-OpTypeImage-09638] ",
                 &local_15e);
      std::allocator<char>::~allocator(&local_15e);
    }
    else if (param_2_local._4_4_ == 0x25ba) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,"[VUID-StandaloneSpirv-OpEntryPoint-09658] ",
                 &local_15f);
      std::allocator<char>::~allocator(&local_15f);
    }
    else if (param_2_local._4_4_ == 0x25bb) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,"[VUID-StandaloneSpirv-OpEntryPoint-09659] ",
                 &local_160);
      std::allocator<char>::~allocator(&local_160);
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,"",&local_161);
      std::allocator<char>::~allocator(&local_161);
    }
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"",&local_29);
    std::allocator<char>::~allocator(&local_29);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string ValidationState_t::VkErrorID(uint32_t id,
                                         const char* /*reference*/) const {
  if (!spvIsVulkanEnv(context_->target_env)) {
    return "";
  }

  // This large switch case is only searched when an error has occurred.
  // If an id is changed, the old case must be modified or removed. Each string
  // here is interpreted as being "implemented"

  // Clang format adds spaces between hyphens
  // clang-format off
  switch (id) {
    case 4154:
      return VUID_WRAP(VUID-BaryCoordKHR-BaryCoordKHR-04154);
    case 4155:
      return VUID_WRAP(VUID-BaryCoordKHR-BaryCoordKHR-04155);
    case 4156:
      return VUID_WRAP(VUID-BaryCoordKHR-BaryCoordKHR-04156);
    case 4160:
      return VUID_WRAP(VUID-BaryCoordNoPerspKHR-BaryCoordNoPerspKHR-04160);
    case 4161:
      return VUID_WRAP(VUID-BaryCoordNoPerspKHR-BaryCoordNoPerspKHR-04161);
    case 4162:
      return VUID_WRAP(VUID-BaryCoordNoPerspKHR-BaryCoordNoPerspKHR-04162);
    case 4181:
      return VUID_WRAP(VUID-BaseInstance-BaseInstance-04181);
    case 4182:
      return VUID_WRAP(VUID-BaseInstance-BaseInstance-04182);
    case 4183:
      return VUID_WRAP(VUID-BaseInstance-BaseInstance-04183);
    case 4184:
      return VUID_WRAP(VUID-BaseVertex-BaseVertex-04184);
    case 4185:
      return VUID_WRAP(VUID-BaseVertex-BaseVertex-04185);
    case 4186:
      return VUID_WRAP(VUID-BaseVertex-BaseVertex-04186);
    case 4187:
      return VUID_WRAP(VUID-ClipDistance-ClipDistance-04187);
    case 4188:
      return VUID_WRAP(VUID-ClipDistance-ClipDistance-04188);
    case 4189:
      return VUID_WRAP(VUID-ClipDistance-ClipDistance-04189);
    case 4190:
      return VUID_WRAP(VUID-ClipDistance-ClipDistance-04190);
    case 4191:
      return VUID_WRAP(VUID-ClipDistance-ClipDistance-04191);
    case 4196:
      return VUID_WRAP(VUID-CullDistance-CullDistance-04196);
    case 4197:
      return VUID_WRAP(VUID-CullDistance-CullDistance-04197);
    case 4198:
      return VUID_WRAP(VUID-CullDistance-CullDistance-04198);
    case 4199:
      return VUID_WRAP(VUID-CullDistance-CullDistance-04199);
    case 4200:
      return VUID_WRAP(VUID-CullDistance-CullDistance-04200);
    case 6735:
      return VUID_WRAP(VUID-CullMaskKHR-CullMaskKHR-06735); // Execution Model
    case 6736:
      return VUID_WRAP(VUID-CullMaskKHR-CullMaskKHR-06736); // input storage
    case 6737:
      return VUID_WRAP(VUID-CullMaskKHR-CullMaskKHR-06737); // 32 int scalar
    case 4205:
      return VUID_WRAP(VUID-DeviceIndex-DeviceIndex-04205);
    case 4206:
      return VUID_WRAP(VUID-DeviceIndex-DeviceIndex-04206);
    case 4207:
      return VUID_WRAP(VUID-DrawIndex-DrawIndex-04207);
    case 4208:
      return VUID_WRAP(VUID-DrawIndex-DrawIndex-04208);
    case 4209:
      return VUID_WRAP(VUID-DrawIndex-DrawIndex-04209);
    case 4210:
      return VUID_WRAP(VUID-FragCoord-FragCoord-04210);
    case 4211:
      return VUID_WRAP(VUID-FragCoord-FragCoord-04211);
    case 4212:
      return VUID_WRAP(VUID-FragCoord-FragCoord-04212);
    case 4213:
      return VUID_WRAP(VUID-FragDepth-FragDepth-04213);
    case 4214:
      return VUID_WRAP(VUID-FragDepth-FragDepth-04214);
    case 4215:
      return VUID_WRAP(VUID-FragDepth-FragDepth-04215);
    case 4216:
      return VUID_WRAP(VUID-FragDepth-FragDepth-04216);
    case 4217:
      return VUID_WRAP(VUID-FragInvocationCountEXT-FragInvocationCountEXT-04217);
    case 4218:
      return VUID_WRAP(VUID-FragInvocationCountEXT-FragInvocationCountEXT-04218);
    case 4219:
      return VUID_WRAP(VUID-FragInvocationCountEXT-FragInvocationCountEXT-04219);
    case 4220:
      return VUID_WRAP(VUID-FragSizeEXT-FragSizeEXT-04220);
    case 4221:
      return VUID_WRAP(VUID-FragSizeEXT-FragSizeEXT-04221);
    case 4222:
      return VUID_WRAP(VUID-FragSizeEXT-FragSizeEXT-04222);
    case 4223:
      return VUID_WRAP(VUID-FragStencilRefEXT-FragStencilRefEXT-04223);
    case 4224:
      return VUID_WRAP(VUID-FragStencilRefEXT-FragStencilRefEXT-04224);
    case 4225:
      return VUID_WRAP(VUID-FragStencilRefEXT-FragStencilRefEXT-04225);
    case 4229:
      return VUID_WRAP(VUID-FrontFacing-FrontFacing-04229);
    case 4230:
      return VUID_WRAP(VUID-FrontFacing-FrontFacing-04230);
    case 4231:
      return VUID_WRAP(VUID-FrontFacing-FrontFacing-04231);
    case 4232:
      return VUID_WRAP(VUID-FullyCoveredEXT-FullyCoveredEXT-04232);
    case 4233:
      return VUID_WRAP(VUID-FullyCoveredEXT-FullyCoveredEXT-04233);
    case 4234:
      return VUID_WRAP(VUID-FullyCoveredEXT-FullyCoveredEXT-04234);
    case 4236:
      return VUID_WRAP(VUID-GlobalInvocationId-GlobalInvocationId-04236);
    case 4237:
      return VUID_WRAP(VUID-GlobalInvocationId-GlobalInvocationId-04237);
    case 4238:
      return VUID_WRAP(VUID-GlobalInvocationId-GlobalInvocationId-04238);
    case 4239:
      return VUID_WRAP(VUID-HelperInvocation-HelperInvocation-04239);
    case 4240:
      return VUID_WRAP(VUID-HelperInvocation-HelperInvocation-04240);
    case 4241:
      return VUID_WRAP(VUID-HelperInvocation-HelperInvocation-04241);
    case 4242:
      return VUID_WRAP(VUID-HitKindKHR-HitKindKHR-04242);
    case 4243:
      return VUID_WRAP(VUID-HitKindKHR-HitKindKHR-04243);
    case 4244:
      return VUID_WRAP(VUID-HitKindKHR-HitKindKHR-04244);
    case 4245:
      return VUID_WRAP(VUID-HitTNV-HitTNV-04245);
    case 4246:
      return VUID_WRAP(VUID-HitTNV-HitTNV-04246);
    case 4247:
      return VUID_WRAP(VUID-HitTNV-HitTNV-04247);
    case 4248:
      return VUID_WRAP(VUID-IncomingRayFlagsKHR-IncomingRayFlagsKHR-04248);
    case 4249:
      return VUID_WRAP(VUID-IncomingRayFlagsKHR-IncomingRayFlagsKHR-04249);
    case 4250:
      return VUID_WRAP(VUID-IncomingRayFlagsKHR-IncomingRayFlagsKHR-04250);
    case 4251:
      return VUID_WRAP(VUID-InstanceCustomIndexKHR-InstanceCustomIndexKHR-04251);
    case 4252:
      return VUID_WRAP(VUID-InstanceCustomIndexKHR-InstanceCustomIndexKHR-04252);
    case 4253:
      return VUID_WRAP(VUID-InstanceCustomIndexKHR-InstanceCustomIndexKHR-04253);
    case 4254:
      return VUID_WRAP(VUID-InstanceId-InstanceId-04254);
    case 4255:
      return VUID_WRAP(VUID-InstanceId-InstanceId-04255);
    case 4256:
      return VUID_WRAP(VUID-InstanceId-InstanceId-04256);
    case 4257:
      return VUID_WRAP(VUID-InvocationId-InvocationId-04257);
    case 4258:
      return VUID_WRAP(VUID-InvocationId-InvocationId-04258);
    case 4259:
      return VUID_WRAP(VUID-InvocationId-InvocationId-04259);
    case 4263:
      return VUID_WRAP(VUID-InstanceIndex-InstanceIndex-04263);
    case 4264:
      return VUID_WRAP(VUID-InstanceIndex-InstanceIndex-04264);
    case 4265:
      return VUID_WRAP(VUID-InstanceIndex-InstanceIndex-04265);
    case 4266:
      return VUID_WRAP(VUID-LaunchIdKHR-LaunchIdKHR-04266);
    case 4267:
      return VUID_WRAP(VUID-LaunchIdKHR-LaunchIdKHR-04267);
    case 4268:
      return VUID_WRAP(VUID-LaunchIdKHR-LaunchIdKHR-04268);
    case 4269:
      return VUID_WRAP(VUID-LaunchSizeKHR-LaunchSizeKHR-04269);
    case 4270:
      return VUID_WRAP(VUID-LaunchSizeKHR-LaunchSizeKHR-04270);
    case 4271:
      return VUID_WRAP(VUID-LaunchSizeKHR-LaunchSizeKHR-04271);
    case 4272:
      return VUID_WRAP(VUID-Layer-Layer-04272);
    case 4273:
      return VUID_WRAP(VUID-Layer-Layer-04273);
    case 4274:
      return VUID_WRAP(VUID-Layer-Layer-04274);
    case 4275:
      return VUID_WRAP(VUID-Layer-Layer-04275);
    case 4276:
      return VUID_WRAP(VUID-Layer-Layer-04276);
    case 4281:
      return VUID_WRAP(VUID-LocalInvocationId-LocalInvocationId-04281);
    case 4282:
      return VUID_WRAP(VUID-LocalInvocationId-LocalInvocationId-04282);
    case 4283:
      return VUID_WRAP(VUID-LocalInvocationId-LocalInvocationId-04283);
    case 4293:
      return VUID_WRAP(VUID-NumSubgroups-NumSubgroups-04293);
    case 4294:
      return VUID_WRAP(VUID-NumSubgroups-NumSubgroups-04294);
    case 4295:
      return VUID_WRAP(VUID-NumSubgroups-NumSubgroups-04295);
    case 4296:
      return VUID_WRAP(VUID-NumWorkgroups-NumWorkgroups-04296);
    case 4297:
      return VUID_WRAP(VUID-NumWorkgroups-NumWorkgroups-04297);
    case 4298:
      return VUID_WRAP(VUID-NumWorkgroups-NumWorkgroups-04298);
    case 4299:
      return VUID_WRAP(VUID-ObjectRayDirectionKHR-ObjectRayDirectionKHR-04299);
    case 4300:
      return VUID_WRAP(VUID-ObjectRayDirectionKHR-ObjectRayDirectionKHR-04300);
    case 4301:
      return VUID_WRAP(VUID-ObjectRayDirectionKHR-ObjectRayDirectionKHR-04301);
    case 4302:
      return VUID_WRAP(VUID-ObjectRayOriginKHR-ObjectRayOriginKHR-04302);
    case 4303:
      return VUID_WRAP(VUID-ObjectRayOriginKHR-ObjectRayOriginKHR-04303);
    case 4304:
      return VUID_WRAP(VUID-ObjectRayOriginKHR-ObjectRayOriginKHR-04304);
    case 4305:
      return VUID_WRAP(VUID-ObjectToWorldKHR-ObjectToWorldKHR-04305);
    case 4306:
      return VUID_WRAP(VUID-ObjectToWorldKHR-ObjectToWorldKHR-04306);
    case 4307:
      return VUID_WRAP(VUID-ObjectToWorldKHR-ObjectToWorldKHR-04307);
    case 4308:
      return VUID_WRAP(VUID-PatchVertices-PatchVertices-04308);
    case 4309:
      return VUID_WRAP(VUID-PatchVertices-PatchVertices-04309);
    case 4310:
      return VUID_WRAP(VUID-PatchVertices-PatchVertices-04310);
    case 4311:
      return VUID_WRAP(VUID-PointCoord-PointCoord-04311);
    case 4312:
      return VUID_WRAP(VUID-PointCoord-PointCoord-04312);
    case 4313:
      return VUID_WRAP(VUID-PointCoord-PointCoord-04313);
    case 4314:
      return VUID_WRAP(VUID-PointSize-PointSize-04314);
    case 4315:
      return VUID_WRAP(VUID-PointSize-PointSize-04315);
    case 4316:
      return VUID_WRAP(VUID-PointSize-PointSize-04316);
    case 4317:
      return VUID_WRAP(VUID-PointSize-PointSize-04317);
    case 4318:
      return VUID_WRAP(VUID-Position-Position-04318);
    case 4319:
      return VUID_WRAP(VUID-Position-Position-04319);
    case 4320:
      return VUID_WRAP(VUID-Position-Position-04320);
    case 4321:
      return VUID_WRAP(VUID-Position-Position-04321);
    case 4330:
      return VUID_WRAP(VUID-PrimitiveId-PrimitiveId-04330);
    case 4334:
      return VUID_WRAP(VUID-PrimitiveId-PrimitiveId-04334);
    case 4337:
      return VUID_WRAP(VUID-PrimitiveId-PrimitiveId-04337);
    case 4345:
      return VUID_WRAP(VUID-RayGeometryIndexKHR-RayGeometryIndexKHR-04345);
    case 4346:
      return VUID_WRAP(VUID-RayGeometryIndexKHR-RayGeometryIndexKHR-04346);
    case 4347:
      return VUID_WRAP(VUID-RayGeometryIndexKHR-RayGeometryIndexKHR-04347);
    case 4348:
      return VUID_WRAP(VUID-RayTmaxKHR-RayTmaxKHR-04348);
    case 4349:
      return VUID_WRAP(VUID-RayTmaxKHR-RayTmaxKHR-04349);
    case 4350:
      return VUID_WRAP(VUID-RayTmaxKHR-RayTmaxKHR-04350);
    case 4351:
      return VUID_WRAP(VUID-RayTminKHR-RayTminKHR-04351);
    case 4352:
      return VUID_WRAP(VUID-RayTminKHR-RayTminKHR-04352);
    case 4353:
      return VUID_WRAP(VUID-RayTminKHR-RayTminKHR-04353);
    case 4354:
      return VUID_WRAP(VUID-SampleId-SampleId-04354);
    case 4355:
      return VUID_WRAP(VUID-SampleId-SampleId-04355);
    case 4356:
      return VUID_WRAP(VUID-SampleId-SampleId-04356);
    case 4357:
      return VUID_WRAP(VUID-SampleMask-SampleMask-04357);
    case 4358:
      return VUID_WRAP(VUID-SampleMask-SampleMask-04358);
    case 4359:
      return VUID_WRAP(VUID-SampleMask-SampleMask-04359);
    case 4360:
      return VUID_WRAP(VUID-SamplePosition-SamplePosition-04360);
    case 4361:
      return VUID_WRAP(VUID-SamplePosition-SamplePosition-04361);
    case 4362:
      return VUID_WRAP(VUID-SamplePosition-SamplePosition-04362);
    case 4367:
      return VUID_WRAP(VUID-SubgroupId-SubgroupId-04367);
    case 4368:
      return VUID_WRAP(VUID-SubgroupId-SubgroupId-04368);
    case 4369:
      return VUID_WRAP(VUID-SubgroupId-SubgroupId-04369);
    case 4370:
      return VUID_WRAP(VUID-SubgroupEqMask-SubgroupEqMask-04370);
    case 4371:
      return VUID_WRAP(VUID-SubgroupEqMask-SubgroupEqMask-04371);
    case 4372:
      return VUID_WRAP(VUID-SubgroupGeMask-SubgroupGeMask-04372);
    case 4373:
      return VUID_WRAP(VUID-SubgroupGeMask-SubgroupGeMask-04373);
    case 4374:
      return VUID_WRAP(VUID-SubgroupGtMask-SubgroupGtMask-04374);
    case 4375:
      return VUID_WRAP(VUID-SubgroupGtMask-SubgroupGtMask-04375);
    case 4376:
      return VUID_WRAP(VUID-SubgroupLeMask-SubgroupLeMask-04376);
    case 4377:
      return VUID_WRAP(VUID-SubgroupLeMask-SubgroupLeMask-04377);
    case 4378:
      return VUID_WRAP(VUID-SubgroupLtMask-SubgroupLtMask-04378);
    case 4379:
      return VUID_WRAP(VUID-SubgroupLtMask-SubgroupLtMask-04379);
    case 4380:
      return VUID_WRAP(VUID-SubgroupLocalInvocationId-SubgroupLocalInvocationId-04380);
    case 4381:
      return VUID_WRAP(VUID-SubgroupLocalInvocationId-SubgroupLocalInvocationId-04381);
    case 4382:
      return VUID_WRAP(VUID-SubgroupSize-SubgroupSize-04382);
    case 4383:
      return VUID_WRAP(VUID-SubgroupSize-SubgroupSize-04383);
    case 4387:
      return VUID_WRAP(VUID-TessCoord-TessCoord-04387);
    case 4388:
      return VUID_WRAP(VUID-TessCoord-TessCoord-04388);
    case 4389:
      return VUID_WRAP(VUID-TessCoord-TessCoord-04389);
    case 4390:
      return VUID_WRAP(VUID-TessLevelOuter-TessLevelOuter-04390);
    case 4391:
      return VUID_WRAP(VUID-TessLevelOuter-TessLevelOuter-04391);
    case 4392:
      return VUID_WRAP(VUID-TessLevelOuter-TessLevelOuter-04392);
    case 4393:
      return VUID_WRAP(VUID-TessLevelOuter-TessLevelOuter-04393);
    case 4394:
      return VUID_WRAP(VUID-TessLevelInner-TessLevelInner-04394);
    case 4395:
      return VUID_WRAP(VUID-TessLevelInner-TessLevelInner-04395);
    case 4396:
      return VUID_WRAP(VUID-TessLevelInner-TessLevelInner-04396);
    case 4397:
      return VUID_WRAP(VUID-TessLevelInner-TessLevelInner-04397);
    case 4398:
      return VUID_WRAP(VUID-VertexIndex-VertexIndex-04398);
    case 4399:
      return VUID_WRAP(VUID-VertexIndex-VertexIndex-04399);
    case 4400:
      return VUID_WRAP(VUID-VertexIndex-VertexIndex-04400);
    case 4401:
      return VUID_WRAP(VUID-ViewIndex-ViewIndex-04401);
    case 4402:
      return VUID_WRAP(VUID-ViewIndex-ViewIndex-04402);
    case 4403:
      return VUID_WRAP(VUID-ViewIndex-ViewIndex-04403);
    case 4404:
      return VUID_WRAP(VUID-ViewportIndex-ViewportIndex-04404);
    case 4405:
      return VUID_WRAP(VUID-ViewportIndex-ViewportIndex-04405);
    case 4406:
      return VUID_WRAP(VUID-ViewportIndex-ViewportIndex-04406);
    case 4407:
      return VUID_WRAP(VUID-ViewportIndex-ViewportIndex-04407);
    case 4408:
      return VUID_WRAP(VUID-ViewportIndex-ViewportIndex-04408);
    case 4422:
      return VUID_WRAP(VUID-WorkgroupId-WorkgroupId-04422);
    case 4423:
      return VUID_WRAP(VUID-WorkgroupId-WorkgroupId-04423);
    case 4424:
      return VUID_WRAP(VUID-WorkgroupId-WorkgroupId-04424);
    case 4425:
      return VUID_WRAP(VUID-WorkgroupSize-WorkgroupSize-04425);
    case 4426:
      return VUID_WRAP(VUID-WorkgroupSize-WorkgroupSize-04426);
    case 4427:
      return VUID_WRAP(VUID-WorkgroupSize-WorkgroupSize-04427);
    case 4428:
      return VUID_WRAP(VUID-WorldRayDirectionKHR-WorldRayDirectionKHR-04428);
    case 4429:
      return VUID_WRAP(VUID-WorldRayDirectionKHR-WorldRayDirectionKHR-04429);
    case 4430:
      return VUID_WRAP(VUID-WorldRayDirectionKHR-WorldRayDirectionKHR-04430);
    case 4431:
      return VUID_WRAP(VUID-WorldRayOriginKHR-WorldRayOriginKHR-04431);
    case 4432:
      return VUID_WRAP(VUID-WorldRayOriginKHR-WorldRayOriginKHR-04432);
    case 4433:
      return VUID_WRAP(VUID-WorldRayOriginKHR-WorldRayOriginKHR-04433);
    case 4434:
      return VUID_WRAP(VUID-WorldToObjectKHR-WorldToObjectKHR-04434);
    case 4435:
      return VUID_WRAP(VUID-WorldToObjectKHR-WorldToObjectKHR-04435);
    case 4436:
      return VUID_WRAP(VUID-WorldToObjectKHR-WorldToObjectKHR-04436);
    case 4484:
      return VUID_WRAP(VUID-PrimitiveShadingRateKHR-PrimitiveShadingRateKHR-04484);
    case 4485:
      return VUID_WRAP(VUID-PrimitiveShadingRateKHR-PrimitiveShadingRateKHR-04485);
    case 4486:
      return VUID_WRAP(VUID-PrimitiveShadingRateKHR-PrimitiveShadingRateKHR-04486);
    case 4490:
      return VUID_WRAP(VUID-ShadingRateKHR-ShadingRateKHR-04490);
    case 4491:
      return VUID_WRAP(VUID-ShadingRateKHR-ShadingRateKHR-04491);
    case 4492:
      return VUID_WRAP(VUID-ShadingRateKHR-ShadingRateKHR-04492);
    case 4633:
      return VUID_WRAP(VUID-StandaloneSpirv-None-04633);
    case 4634:
      return VUID_WRAP(VUID-StandaloneSpirv-None-04634);
    case 4635:
      return VUID_WRAP(VUID-StandaloneSpirv-None-04635);
    case 4636:
      return VUID_WRAP(VUID-StandaloneSpirv-None-04636);
    case 4637:
      return VUID_WRAP(VUID-StandaloneSpirv-None-04637);
    case 4638:
      return VUID_WRAP(VUID-StandaloneSpirv-None-04638);
    case 7321:
      return VUID_WRAP(VUID-StandaloneSpirv-None-07321);
    case 4640:
      return VUID_WRAP(VUID-StandaloneSpirv-None-04640);
    case 4641:
      return VUID_WRAP(VUID-StandaloneSpirv-None-04641);
    case 4642:
      return VUID_WRAP(VUID-StandaloneSpirv-None-04642);
    case 4643:
      return VUID_WRAP(VUID-StandaloneSpirv-None-04643);
    case 4644:
      return VUID_WRAP(VUID-StandaloneSpirv-None-04644);
    case 4645:
      return VUID_WRAP(VUID-StandaloneSpirv-None-04645);
    case 4650:
      return VUID_WRAP(VUID-StandaloneSpirv-OpControlBarrier-04650);
    case 4651:
      return VUID_WRAP(VUID-StandaloneSpirv-OpVariable-04651);
    case 4652:
      return VUID_WRAP(VUID-StandaloneSpirv-OpReadClockKHR-04652);
    case 4653:
      return VUID_WRAP(VUID-StandaloneSpirv-OriginLowerLeft-04653);
    case 4654:
      return VUID_WRAP(VUID-StandaloneSpirv-PixelCenterInteger-04654);
    case 4655:
      return VUID_WRAP(VUID-StandaloneSpirv-UniformConstant-04655);
    case 4656:
      return VUID_WRAP(VUID-StandaloneSpirv-OpTypeImage-04656);
    case 4657:
      return VUID_WRAP(VUID-StandaloneSpirv-OpTypeImage-04657);
    case 4658:
      return VUID_WRAP(VUID-StandaloneSpirv-OpImageTexelPointer-04658);
    case 4659:
      return VUID_WRAP(VUID-StandaloneSpirv-OpImageQuerySizeLod-04659);
    case 4663:
      return VUID_WRAP(VUID-StandaloneSpirv-Offset-04663);
    case 4664:
      return VUID_WRAP(VUID-StandaloneSpirv-OpImageGather-04664);
    case 4667:
      return VUID_WRAP(VUID-StandaloneSpirv-None-04667);
    case 4669:
      return VUID_WRAP(VUID-StandaloneSpirv-GLSLShared-04669);
    case 4670:
      return VUID_WRAP(VUID-StandaloneSpirv-Flat-04670);
    case 4675:
      return VUID_WRAP(VUID-StandaloneSpirv-FPRoundingMode-04675);
    case 4677:
      return VUID_WRAP(VUID-StandaloneSpirv-Invariant-04677);
    case 4680:
      return VUID_WRAP(VUID-StandaloneSpirv-OpTypeRuntimeArray-04680);
    case 4682:
      return VUID_WRAP(VUID-StandaloneSpirv-OpControlBarrier-04682);
    case 6426:
      return VUID_WRAP(VUID-StandaloneSpirv-LocalSize-06426); // formally 04683
    case 4685:
      return VUID_WRAP(VUID-StandaloneSpirv-OpGroupNonUniformBallotBitCount-04685);
    case 4686:
      return VUID_WRAP(VUID-StandaloneSpirv-None-04686);
    case 4698:
      return VUID_WRAP(VUID-StandaloneSpirv-RayPayloadKHR-04698);
    case 4699:
      return VUID_WRAP(VUID-StandaloneSpirv-IncomingRayPayloadKHR-04699);
    case 4700:
      return VUID_WRAP(VUID-StandaloneSpirv-IncomingRayPayloadKHR-04700);
    case 4701:
      return VUID_WRAP(VUID-StandaloneSpirv-HitAttributeKHR-04701);
    case 4702:
      return VUID_WRAP(VUID-StandaloneSpirv-HitAttributeKHR-04702);
    case 4703:
      return VUID_WRAP(VUID-StandaloneSpirv-HitAttributeKHR-04703);
    case 4704:
      return VUID_WRAP(VUID-StandaloneSpirv-CallableDataKHR-04704);
    case 4705:
      return VUID_WRAP(VUID-StandaloneSpirv-IncomingCallableDataKHR-04705);
    case 4706:
      return VUID_WRAP(VUID-StandaloneSpirv-IncomingCallableDataKHR-04706);
    case 7119:
      return VUID_WRAP(VUID-StandaloneSpirv-ShaderRecordBufferKHR-07119);
    case 4708:
      return VUID_WRAP(VUID-StandaloneSpirv-PhysicalStorageBuffer64-04708);
    case 4710:
      return VUID_WRAP(VUID-StandaloneSpirv-PhysicalStorageBuffer64-04710);
    case 4711:
      return VUID_WRAP(VUID-StandaloneSpirv-OpTypeForwardPointer-04711);
    case 4730:
      return VUID_WRAP(VUID-StandaloneSpirv-OpAtomicStore-04730);
    case 4731:
      return VUID_WRAP(VUID-StandaloneSpirv-OpAtomicLoad-04731);
    case 4732:
      return VUID_WRAP(VUID-StandaloneSpirv-OpMemoryBarrier-04732);
    case 4733:
      return VUID_WRAP(VUID-StandaloneSpirv-OpMemoryBarrier-04733);
    case 4734:
      return VUID_WRAP(VUID-StandaloneSpirv-OpVariable-04734);
    case 4744:
      return VUID_WRAP(VUID-StandaloneSpirv-Flat-04744);
    case 4777:
      return VUID_WRAP(VUID-StandaloneSpirv-OpImage-04777);
    case 4780:
      return VUID_WRAP(VUID-StandaloneSpirv-Result-04780);
    case 4781:
      return VUID_WRAP(VUID-StandaloneSpirv-Base-04781);
    case 4915:
      return VUID_WRAP(VUID-StandaloneSpirv-Location-04915);
    case 4916:
      return VUID_WRAP(VUID-StandaloneSpirv-Location-04916);
    case 4917:
      return VUID_WRAP(VUID-StandaloneSpirv-Location-04917);
    case 4918:
      return VUID_WRAP(VUID-StandaloneSpirv-Location-04918);
    case 4919:
      return VUID_WRAP(VUID-StandaloneSpirv-Location-04919);
    case 4920:
      return VUID_WRAP(VUID-StandaloneSpirv-Component-04920);
    case 4921:
      return VUID_WRAP(VUID-StandaloneSpirv-Component-04921);
    case 4922:
      return VUID_WRAP(VUID-StandaloneSpirv-Component-04922);
    case 4923:
      return VUID_WRAP(VUID-StandaloneSpirv-Component-04923);
    case 4924:
      return VUID_WRAP(VUID-StandaloneSpirv-Component-04924);
    case 6201:
      return VUID_WRAP(VUID-StandaloneSpirv-Flat-06201);
    case 6202:
      return VUID_WRAP(VUID-StandaloneSpirv-Flat-06202);
    case 6214:
      return VUID_WRAP(VUID-StandaloneSpirv-OpTypeImage-06214);
    case 6491:
      return VUID_WRAP(VUID-StandaloneSpirv-DescriptorSet-06491);
    case 6671:
      return VUID_WRAP(VUID-StandaloneSpirv-OpTypeSampledImage-06671);
    case 6672:
      return VUID_WRAP(VUID-StandaloneSpirv-Location-06672);
    case 6673:
      return VUID_WRAP(VUID-StandaloneSpirv-OpVariable-06673);
    case 6674:
      return VUID_WRAP(VUID-StandaloneSpirv-OpEntryPoint-06674);
    case 6675:
      return VUID_WRAP(VUID-StandaloneSpirv-PushConstant-06675);
    case 6676:
      return VUID_WRAP(VUID-StandaloneSpirv-Uniform-06676);
    case 6677:
      return VUID_WRAP(VUID-StandaloneSpirv-UniformConstant-06677);
    case 6678:
      return VUID_WRAP(VUID-StandaloneSpirv-InputAttachmentIndex-06678);
    case 6777:
      return VUID_WRAP(VUID-StandaloneSpirv-PerVertexKHR-06777);
    case 6778:
      return VUID_WRAP(VUID-StandaloneSpirv-Input-06778);
    case 6807:
      return VUID_WRAP(VUID-StandaloneSpirv-Uniform-06807);
    case 6808:
      return VUID_WRAP(VUID-StandaloneSpirv-PushConstant-06808);
    case 6924:
      return VUID_WRAP(VUID-StandaloneSpirv-OpTypeImage-06924);
    case 6925:
      return VUID_WRAP(VUID-StandaloneSpirv-Uniform-06925);
    case 7041:
      return VUID_WRAP(VUID-PrimitivePointIndicesEXT-PrimitivePointIndicesEXT-07041);
    case 7043:
      return VUID_WRAP(VUID-PrimitivePointIndicesEXT-PrimitivePointIndicesEXT-07043);
    case 7044:
      return VUID_WRAP(VUID-PrimitivePointIndicesEXT-PrimitivePointIndicesEXT-07044);
    case 7047:
      return VUID_WRAP(VUID-PrimitiveLineIndicesEXT-PrimitiveLineIndicesEXT-07047);
    case 7049:
      return VUID_WRAP(VUID-PrimitiveLineIndicesEXT-PrimitiveLineIndicesEXT-07049);
    case 7050:
      return VUID_WRAP(VUID-PrimitiveLineIndicesEXT-PrimitiveLineIndicesEXT-07050);
    case 7053:
      return VUID_WRAP(VUID-PrimitiveTriangleIndicesEXT-PrimitiveTriangleIndicesEXT-07053);
    case 7055:
      return VUID_WRAP(VUID-PrimitiveTriangleIndicesEXT-PrimitiveTriangleIndicesEXT-07055);
    case 7056:
      return VUID_WRAP(VUID-PrimitiveTriangleIndicesEXT-PrimitiveTriangleIndicesEXT-07056);
    case 7102:
      return VUID_WRAP(VUID-StandaloneSpirv-MeshEXT-07102);
    case 7320:
      return VUID_WRAP(VUID-StandaloneSpirv-ExecutionModel-07320);
    case 7290:
      return VUID_WRAP(VUID-StandaloneSpirv-Input-07290);
    case 7650:
      return VUID_WRAP(VUID-StandaloneSpirv-Base-07650);
    case 7651:
      return VUID_WRAP(VUID-StandaloneSpirv-Base-07651);
    case 7652:
      return VUID_WRAP(VUID-StandaloneSpirv-Base-07652);
    case 7703:
      return VUID_WRAP(VUID-StandaloneSpirv-Component-07703);
    case 7951:
      return VUID_WRAP(VUID-StandaloneSpirv-SubgroupVoteKHR-07951);
    case 8721:
      return VUID_WRAP(VUID-StandaloneSpirv-OpEntryPoint-08721);
    case 8722:
      return VUID_WRAP(VUID-StandaloneSpirv-OpEntryPoint-08722);
    case 8973:
      return VUID_WRAP(VUID-StandaloneSpirv-Pointer-08973);
    case 9638:
      return VUID_WRAP(VUID-StandaloneSpirv-OpTypeImage-09638);
    case 9658:
      return VUID_WRAP(VUID-StandaloneSpirv-OpEntryPoint-09658);
    case 9659:
      return VUID_WRAP(VUID-StandaloneSpirv-OpEntryPoint-09659);
    default:
      return "";  // unknown id
  }
  // clang-format on
}